

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  ulong uVar31;
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  byte bVar84;
  byte bVar85;
  ulong uVar86;
  uint uVar87;
  uint uVar88;
  long lVar89;
  uint uVar90;
  long lVar91;
  ulong uVar92;
  byte bVar93;
  float fVar94;
  float fVar95;
  float fVar145;
  float fVar147;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar146;
  float fVar148;
  float fVar150;
  float fVar151;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar149;
  float fVar152;
  float fVar153;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined4 uVar154;
  undefined8 uVar155;
  vint4 bi_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 bi_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  vint4 bi;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar184;
  float fVar192;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  float fVar193;
  float fVar202;
  float fVar203;
  vint4 ai_2;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar204;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  vint4 ai_1;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  vint4 ai;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [16];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_760;
  undefined8 uStack_758;
  RTCFilterFunctionNArguments local_748;
  undefined1 (*local_718) [32];
  undefined1 local_710 [16];
  uint local_700;
  undefined4 uStack_6fc;
  undefined8 uStack_6f8;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined8 uStack_5f8;
  LinearSpace3fa *local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_420;
  int local_41c;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  byte local_3d0;
  float local_3c0 [4];
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar86 = (ulong)(byte)PVar6;
  lVar32 = uVar86 * 0x25;
  fVar193 = *(float *)(prim + lVar32 + 0x12);
  auVar100 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar100 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar100 = vsubps_avx(auVar100,*(undefined1 (*) [16])(prim + lVar32 + 6));
  auVar185._0_4_ = fVar193 * auVar100._0_4_;
  auVar185._4_4_ = fVar193 * auVar100._4_4_;
  auVar185._8_4_ = fVar193 * auVar100._8_4_;
  auVar185._12_4_ = fVar193 * auVar100._12_4_;
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar156._0_4_ = fVar193 * auVar99._0_4_;
  auVar156._4_4_ = fVar193 * auVar99._4_4_;
  auVar156._8_4_ = fVar193 * auVar99._8_4_;
  auVar156._12_4_ = fVar193 * auVar99._12_4_;
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 5 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xf + 6)));
  auVar237 = vcvtdq2ps_avx(auVar237);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar86 + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1a + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1b + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1c + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar205._4_4_ = auVar156._0_4_;
  auVar205._0_4_ = auVar156._0_4_;
  auVar205._8_4_ = auVar156._0_4_;
  auVar205._12_4_ = auVar156._0_4_;
  auVar29 = vshufps_avx(auVar156,auVar156,0x55);
  auVar101 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar193 = auVar101._0_4_;
  auVar175._0_4_ = fVar193 * auVar237._0_4_;
  fVar202 = auVar101._4_4_;
  auVar175._4_4_ = fVar202 * auVar237._4_4_;
  fVar203 = auVar101._8_4_;
  auVar175._8_4_ = fVar203 * auVar237._8_4_;
  fVar204 = auVar101._12_4_;
  auVar175._12_4_ = fVar204 * auVar237._12_4_;
  auVar170._0_4_ = auVar25._0_4_ * fVar193;
  auVar170._4_4_ = auVar25._4_4_ * fVar202;
  auVar170._8_4_ = auVar25._8_4_ * fVar203;
  auVar170._12_4_ = auVar25._12_4_ * fVar204;
  auVar157._0_4_ = auVar28._0_4_ * fVar193;
  auVar157._4_4_ = auVar28._4_4_ * fVar202;
  auVar157._8_4_ = auVar28._8_4_ * fVar203;
  auVar157._12_4_ = auVar28._12_4_ * fVar204;
  auVar101 = vfmadd231ps_fma(auVar175,auVar29,auVar99);
  auVar102 = vfmadd231ps_fma(auVar170,auVar29,auVar24);
  auVar29 = vfmadd231ps_fma(auVar157,auVar27,auVar29);
  auVar33 = vfmadd231ps_fma(auVar101,auVar205,auVar100);
  auVar102 = vfmadd231ps_fma(auVar102,auVar205,auVar23);
  auVar34 = vfmadd231ps_fma(auVar29,auVar26,auVar205);
  auVar230._4_4_ = auVar185._0_4_;
  auVar230._0_4_ = auVar185._0_4_;
  auVar230._8_4_ = auVar185._0_4_;
  auVar230._12_4_ = auVar185._0_4_;
  auVar29 = vshufps_avx(auVar185,auVar185,0x55);
  auVar101 = vshufps_avx(auVar185,auVar185,0xaa);
  fVar193 = auVar101._0_4_;
  auVar206._0_4_ = fVar193 * auVar237._0_4_;
  fVar202 = auVar101._4_4_;
  auVar206._4_4_ = fVar202 * auVar237._4_4_;
  fVar203 = auVar101._8_4_;
  auVar206._8_4_ = fVar203 * auVar237._8_4_;
  fVar204 = auVar101._12_4_;
  auVar206._12_4_ = fVar204 * auVar237._12_4_;
  auVar194._0_4_ = auVar25._0_4_ * fVar193;
  auVar194._4_4_ = auVar25._4_4_ * fVar202;
  auVar194._8_4_ = auVar25._8_4_ * fVar203;
  auVar194._12_4_ = auVar25._12_4_ * fVar204;
  auVar186._0_4_ = auVar28._0_4_ * fVar193;
  auVar186._4_4_ = auVar28._4_4_ * fVar202;
  auVar186._8_4_ = auVar28._8_4_ * fVar203;
  auVar186._12_4_ = auVar28._12_4_ * fVar204;
  auVar99 = vfmadd231ps_fma(auVar206,auVar29,auVar99);
  auVar237 = vfmadd231ps_fma(auVar194,auVar29,auVar24);
  auVar24 = vfmadd231ps_fma(auVar186,auVar29,auVar27);
  auVar35 = vfmadd231ps_fma(auVar99,auVar230,auVar100);
  auVar156 = vfmadd231ps_fma(auVar237,auVar230,auVar23);
  auVar221._8_4_ = 0x7fffffff;
  auVar221._0_8_ = 0x7fffffff7fffffff;
  auVar221._12_4_ = 0x7fffffff;
  auVar157 = vfmadd231ps_fma(auVar24,auVar230,auVar26);
  auVar100 = vandps_avx(auVar221,auVar33);
  auVar218._8_4_ = 0x219392ef;
  auVar218._0_8_ = 0x219392ef219392ef;
  auVar218._12_4_ = 0x219392ef;
  uVar92 = vcmpps_avx512vl(auVar100,auVar218,1);
  bVar16 = (bool)((byte)uVar92 & 1);
  auVar96._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar33._0_4_;
  bVar16 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar33._4_4_;
  bVar16 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar33._8_4_;
  bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar33._12_4_;
  auVar100 = vandps_avx(auVar221,auVar102);
  uVar92 = vcmpps_avx512vl(auVar100,auVar218,1);
  bVar16 = (bool)((byte)uVar92 & 1);
  auVar97._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._0_4_;
  bVar16 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._4_4_;
  bVar16 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._8_4_;
  bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._12_4_;
  auVar100 = vandps_avx(auVar221,auVar34);
  uVar92 = vcmpps_avx512vl(auVar100,auVar218,1);
  bVar16 = (bool)((byte)uVar92 & 1);
  auVar98._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar34._0_4_;
  bVar16 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar34._4_4_;
  bVar16 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar34._8_4_;
  bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar34._12_4_;
  auVar99 = vrcp14ps_avx512vl(auVar96);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = &DAT_3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar100 = vfnmadd213ps_fma(auVar96,auVar99,auVar219);
  auVar33 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar97);
  auVar100 = vfnmadd213ps_fma(auVar97,auVar99,auVar219);
  auVar34 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar98);
  auVar100 = vfnmadd213ps_fma(auVar98,auVar99,auVar219);
  auVar103 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
  fVar193 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar32 + 0x16)) *
            *(float *)(prim + lVar32 + 0x1a);
  auVar216._4_4_ = fVar193;
  auVar216._0_4_ = fVar193;
  auVar216._8_4_ = fVar193;
  auVar216._12_4_ = fVar193;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar100 = vpmovsxwd_avx(auVar100);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 6);
  auVar99 = vpmovsxwd_avx(auVar99);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar23 = vsubps_avx(auVar99,auVar100);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar99 = vpmovsxwd_avx(auVar237);
  auVar237 = vfmadd213ps_fma(auVar23,auVar216,auVar100);
  auVar100 = vcvtdq2ps_avx(auVar99);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar86 * 0xd + 6);
  auVar99 = vpmovsxwd_avx(auVar23);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar100);
  auVar23 = vfmadd213ps_fma(auVar99,auVar216,auVar100);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar86 * 0x12 + 6);
  auVar100 = vpmovsxwd_avx(auVar24);
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar92 = (ulong)(uint)((int)(uVar86 * 5) << 2);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar86 * 2 + uVar92 + 6);
  auVar99 = vpmovsxwd_avx(auVar25);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar100);
  auVar24 = vfmadd213ps_fma(auVar99,auVar216,auVar100);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar92 + 6);
  auVar100 = vpmovsxwd_avx(auVar26);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar86 * 0x18 + 6);
  auVar99 = vpmovsxwd_avx(auVar27);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar100);
  auVar25 = vfmadd213ps_fma(auVar99,auVar216,auVar100);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar86 * 0x1d + 6);
  auVar100 = vpmovsxwd_avx(auVar28);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar86 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar99 = vpmovsxwd_avx(auVar29);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar100);
  auVar26 = vfmadd213ps_fma(auVar99,auVar216,auVar100);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar86) + 6);
  auVar100 = vpmovsxwd_avx(auVar101);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar86 * 0x23 + 6);
  auVar99 = vpmovsxwd_avx(auVar102);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar100);
  auVar99 = vfmadd213ps_fma(auVar99,auVar216,auVar100);
  auVar100 = vsubps_avx(auVar237,auVar35);
  auVar217._0_4_ = auVar33._0_4_ * auVar100._0_4_;
  auVar217._4_4_ = auVar33._4_4_ * auVar100._4_4_;
  auVar217._8_4_ = auVar33._8_4_ * auVar100._8_4_;
  auVar217._12_4_ = auVar33._12_4_ * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar23,auVar35);
  auVar176._0_4_ = auVar33._0_4_ * auVar100._0_4_;
  auVar176._4_4_ = auVar33._4_4_ * auVar100._4_4_;
  auVar176._8_4_ = auVar33._8_4_ * auVar100._8_4_;
  auVar176._12_4_ = auVar33._12_4_ * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar24,auVar156);
  auVar207._0_4_ = auVar34._0_4_ * auVar100._0_4_;
  auVar207._4_4_ = auVar34._4_4_ * auVar100._4_4_;
  auVar207._8_4_ = auVar34._8_4_ * auVar100._8_4_;
  auVar207._12_4_ = auVar34._12_4_ * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar25,auVar156);
  auVar171._0_4_ = auVar34._0_4_ * auVar100._0_4_;
  auVar171._4_4_ = auVar34._4_4_ * auVar100._4_4_;
  auVar171._8_4_ = auVar34._8_4_ * auVar100._8_4_;
  auVar171._12_4_ = auVar34._12_4_ * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar26,auVar157);
  auVar195._0_4_ = auVar103._0_4_ * auVar100._0_4_;
  auVar195._4_4_ = auVar103._4_4_ * auVar100._4_4_;
  auVar195._8_4_ = auVar103._8_4_ * auVar100._8_4_;
  auVar195._12_4_ = auVar103._12_4_ * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar99,auVar157);
  auVar158._0_4_ = auVar103._0_4_ * auVar100._0_4_;
  auVar158._4_4_ = auVar103._4_4_ * auVar100._4_4_;
  auVar158._8_4_ = auVar103._8_4_ * auVar100._8_4_;
  auVar158._12_4_ = auVar103._12_4_ * auVar100._12_4_;
  auVar100 = vpminsd_avx(auVar217,auVar176);
  auVar99 = vpminsd_avx(auVar207,auVar171);
  auVar100 = vmaxps_avx(auVar100,auVar99);
  auVar99 = vpminsd_avx(auVar195,auVar158);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar33._4_4_ = uVar154;
  auVar33._0_4_ = uVar154;
  auVar33._8_4_ = uVar154;
  auVar33._12_4_ = uVar154;
  auVar99 = vmaxps_avx512vl(auVar99,auVar33);
  auVar100 = vmaxps_avx(auVar100,auVar99);
  auVar34._8_4_ = 0x3f7ffffa;
  auVar34._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar34._12_4_ = 0x3f7ffffa;
  local_2b0 = vmulps_avx512vl(auVar100,auVar34);
  auVar100 = vpmaxsd_avx(auVar217,auVar176);
  auVar99 = vpmaxsd_avx(auVar207,auVar171);
  auVar100 = vminps_avx(auVar100,auVar99);
  auVar99 = vpmaxsd_avx(auVar195,auVar158);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar103._4_4_ = uVar154;
  auVar103._0_4_ = uVar154;
  auVar103._8_4_ = uVar154;
  auVar103._12_4_ = uVar154;
  auVar99 = vminps_avx512vl(auVar99,auVar103);
  auVar100 = vminps_avx(auVar100,auVar99);
  auVar35._8_4_ = 0x3f800003;
  auVar35._0_8_ = 0x3f8000033f800003;
  auVar35._12_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar35);
  auVar99 = vpbroadcastd_avx512vl();
  uVar155 = vcmpps_avx512vl(local_2b0,auVar100,2);
  uVar92 = vpcmpgtd_avx512vl(auVar99,_DAT_01ff0cf0);
  uVar92 = ((byte)uVar155 & 0xf) & uVar92;
  if ((char)uVar92 != '\0') {
    local_5e8 = pre->ray_space + k;
    local_718 = (undefined1 (*) [32])&local_180;
    local_280 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar32 = 0;
      for (uVar86 = uVar92; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        lVar32 = lVar32 + 1;
      }
      uVar7 = *(uint *)(prim + 2);
      uVar8 = *(uint *)(prim + lVar32 * 4 + 6);
      pGVar11 = (context->scene->geometries).items[uVar7].ptr;
      uVar86 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                               (ulong)uVar8 *
                               pGVar11[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar193 = (pGVar11->time_range).lower;
      fVar193 = pGVar11->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar193) /
                ((pGVar11->time_range).upper - fVar193));
      auVar100 = vroundss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),9);
      auVar100 = vminss_avx(auVar100,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
      auVar100 = vmaxss_avx(ZEXT816(0) << 0x20,auVar100);
      fVar193 = fVar193 - auVar100._0_4_;
      fVar202 = 1.0 - fVar193;
      _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar91 = (long)(int)auVar100._0_4_ * 0x38;
      lVar89 = *(long *)(_Var12 + 0x10 + lVar91);
      lVar13 = *(long *)(_Var12 + 0x38 + lVar91);
      lVar14 = *(long *)(_Var12 + 0x48 + lVar91);
      auVar159._4_4_ = fVar193;
      auVar159._0_4_ = fVar193;
      auVar159._8_4_ = fVar193;
      auVar159._12_4_ = fVar193;
      pfVar3 = (float *)(lVar13 + lVar14 * uVar86);
      auVar222._0_4_ = fVar193 * *pfVar3;
      auVar222._4_4_ = fVar193 * pfVar3[1];
      auVar222._8_4_ = fVar193 * pfVar3[2];
      auVar222._12_4_ = fVar193 * pfVar3[3];
      lVar32 = uVar86 + 1;
      auVar100 = vmulps_avx512vl(auVar159,*(undefined1 (*) [16])(lVar13 + lVar14 * lVar32));
      p_Var15 = pGVar11[4].occlusionFilterN;
      auVar172._4_4_ = fVar202;
      auVar172._0_4_ = fVar202;
      auVar172._8_4_ = fVar202;
      auVar172._12_4_ = fVar202;
      auVar23 = vfmadd231ps_fma(auVar222,auVar172,
                                *(undefined1 (*) [16])(*(long *)(_Var12 + lVar91) + lVar89 * uVar86)
                               );
      _local_6d0 = vfmadd231ps_avx512vl
                             (auVar100,auVar172,
                              *(undefined1 (*) [16])(*(long *)(_Var12 + lVar91) + lVar89 * lVar32));
      pfVar3 = (float *)(*(long *)(p_Var15 + lVar91 + 0x38) +
                        uVar86 * *(long *)(p_Var15 + lVar91 + 0x48));
      auVar223._0_4_ = fVar193 * *pfVar3;
      auVar223._4_4_ = fVar193 * pfVar3[1];
      auVar223._8_4_ = fVar193 * pfVar3[2];
      auVar223._12_4_ = fVar193 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var15 + lVar91 + 0x38) +
                        *(long *)(p_Var15 + lVar91 + 0x48) * lVar32);
      auVar226._0_4_ = fVar193 * *pfVar3;
      auVar226._4_4_ = fVar193 * pfVar3[1];
      auVar226._8_4_ = fVar193 * pfVar3[2];
      auVar226._12_4_ = fVar193 * pfVar3[3];
      auVar99 = vfmadd231ps_fma(auVar223,auVar172,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var15 + lVar91) +
                                 *(long *)(p_Var15 + lVar91 + 0x10) * uVar86));
      auVar237 = vfmadd231ps_fma(auVar226,auVar172,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var15 + lVar91) +
                                  *(long *)(p_Var15 + lVar91 + 0x10) * lVar32));
      iVar9 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar100 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar100 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      lVar32 = (long)iVar9 * 0x44;
      auVar173._8_4_ = 0xbeaaaaab;
      auVar173._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar173._12_4_ = 0xbeaaaaab;
      local_6e0 = vfnmadd213ps_fma(auVar99,auVar173,auVar23);
      local_6f0 = vfmadd213ps_avx512vl(auVar237,auVar173,_local_6d0);
      auVar237 = vsubps_avx(auVar23,auVar100);
      uVar154 = auVar237._0_4_;
      auVar177._4_4_ = uVar154;
      auVar177._0_4_ = uVar154;
      auVar177._8_4_ = uVar154;
      auVar177._12_4_ = uVar154;
      auVar99 = vshufps_avx(auVar237,auVar237,0x55);
      aVar4 = (local_5e8->vx).field_0;
      aVar5 = (local_5e8->vy).field_0;
      fVar193 = (local_5e8->vz).field_0.m128[0];
      fVar202 = *(float *)((long)&(local_5e8->vz).field_0 + 4);
      fVar203 = *(float *)((long)&(local_5e8->vz).field_0 + 8);
      fVar204 = *(float *)((long)&(local_5e8->vz).field_0 + 0xc);
      auVar237 = vshufps_avx(auVar237,auVar237,0xaa);
      auVar225._0_4_ = fVar193 * auVar237._0_4_;
      auVar225._4_4_ = fVar202 * auVar237._4_4_;
      auVar225._8_4_ = fVar203 * auVar237._8_4_;
      auVar225._12_4_ = fVar204 * auVar237._12_4_;
      auVar99 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar99);
      auVar24 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar177);
      auVar237 = vsubps_avx(local_6e0,auVar100);
      uVar154 = auVar237._0_4_;
      auVar178._4_4_ = uVar154;
      auVar178._0_4_ = uVar154;
      auVar178._8_4_ = uVar154;
      auVar178._12_4_ = uVar154;
      auVar99 = vshufps_avx(auVar237,auVar237,0x55);
      auVar237 = vshufps_avx(auVar237,auVar237,0xaa);
      auVar227._0_4_ = fVar193 * auVar237._0_4_;
      auVar227._4_4_ = fVar202 * auVar237._4_4_;
      auVar227._8_4_ = fVar203 * auVar237._8_4_;
      auVar227._12_4_ = fVar204 * auVar237._12_4_;
      auVar99 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar5,auVar99);
      auVar25 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar178);
      auVar237 = vsubps_avx(local_6f0,auVar100);
      uVar154 = auVar237._0_4_;
      auVar179._4_4_ = uVar154;
      auVar179._0_4_ = uVar154;
      auVar179._8_4_ = uVar154;
      auVar179._12_4_ = uVar154;
      auVar99 = vshufps_avx(auVar237,auVar237,0x55);
      auVar237 = vshufps_avx(auVar237,auVar237,0xaa);
      auVar228._0_4_ = fVar193 * auVar237._0_4_;
      auVar228._4_4_ = fVar202 * auVar237._4_4_;
      auVar228._8_4_ = fVar203 * auVar237._8_4_;
      auVar228._12_4_ = fVar204 * auVar237._12_4_;
      auVar99 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar5,auVar99);
      auVar237 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar179);
      auVar99 = vsubps_avx512vl(_local_6d0,auVar100);
      uVar154 = auVar99._0_4_;
      auVar174._4_4_ = uVar154;
      auVar174._0_4_ = uVar154;
      auVar174._8_4_ = uVar154;
      auVar174._12_4_ = uVar154;
      auVar100 = vshufps_avx(auVar99,auVar99,0x55);
      auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar231._0_4_ = fVar193 * auVar99._0_4_;
      auVar231._4_4_ = fVar202 * auVar99._4_4_;
      auVar231._8_4_ = fVar203 * auVar99._8_4_;
      auVar231._12_4_ = fVar204 * auVar99._12_4_;
      auVar100 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar5,auVar100);
      auVar26 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar4,auVar174);
      auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar32);
      uVar154 = auVar24._0_4_;
      local_540._4_4_ = uVar154;
      local_540._0_4_ = uVar154;
      local_540._8_4_ = uVar154;
      local_540._12_4_ = uVar154;
      local_540._16_4_ = uVar154;
      local_540._20_4_ = uVar154;
      local_540._24_4_ = uVar154;
      local_540._28_4_ = uVar154;
      auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x484);
      auVar104._8_4_ = 1;
      auVar104._0_8_ = 0x100000001;
      auVar104._12_4_ = 1;
      auVar104._16_4_ = 1;
      auVar104._20_4_ = 1;
      auVar104._24_4_ = 1;
      auVar104._28_4_ = 1;
      local_4c0 = vpermps_avx2(auVar104,ZEXT1632(auVar24));
      local_560 = vbroadcastss_avx512vl(auVar25);
      local_4e0 = vpermps_avx512vl(auVar104,ZEXT1632(auVar25));
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x908);
      local_580 = vbroadcastss_avx512vl(auVar237);
      local_5a0 = vpermps_avx512vl(auVar104,ZEXT1632(auVar237));
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0xd8c);
      uVar154 = auVar26._0_4_;
      local_500._4_4_ = uVar154;
      local_500._0_4_ = uVar154;
      local_500._8_4_ = uVar154;
      local_500._12_4_ = uVar154;
      local_500._16_4_ = uVar154;
      local_500._20_4_ = uVar154;
      local_500._24_4_ = uVar154;
      local_500._28_4_ = uVar154;
      local_520 = vpermps_avx2(auVar104,ZEXT1632(auVar26));
      auVar104 = vmulps_avx512vl(local_500,auVar116);
      auVar105 = vmulps_avx512vl(local_520,auVar116);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar117,local_580);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar117,local_5a0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar121,local_560);
      auVar106 = vfmadd231ps_avx512vl(auVar105,auVar121,local_4e0);
      auVar107 = vfmadd231ps_avx512vl(auVar104,auVar119,local_540);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar32);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x484);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x908);
      auVar108 = vfmadd231ps_avx512vl(auVar106,auVar119,local_4c0);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0xd8c);
      auVar243 = ZEXT3264(local_500);
      auVar109 = vmulps_avx512vl(local_500,auVar106);
      auVar244 = ZEXT3264(local_520);
      auVar110 = vmulps_avx512vl(local_520,auVar106);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar115,local_580);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_5a0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_560);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar105,local_4e0);
      auVar27 = vfmadd231ps_fma(auVar109,auVar104,local_540);
      auVar28 = vfmadd231ps_fma(auVar110,auVar104,local_4c0);
      auVar110 = vsubps_avx512vl(ZEXT1632(auVar27),auVar107);
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar28),auVar108);
      auVar109 = vmulps_avx512vl(auVar108,auVar110);
      auVar112 = vmulps_avx512vl(auVar107,auVar111);
      auVar109 = vsubps_avx512vl(auVar109,auVar112);
      auVar100 = vshufps_avx(auVar23,auVar23,0xff);
      uVar155 = auVar100._0_8_;
      local_80._8_8_ = uVar155;
      local_80._0_8_ = uVar155;
      local_80._16_8_ = uVar155;
      local_80._24_8_ = uVar155;
      auVar100 = vshufps_avx(local_6e0,local_6e0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar100);
      auVar100 = vshufps_avx(local_6f0,local_6f0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar100);
      auVar100 = vshufps_avx512vl(_local_6d0,_local_6d0,0xff);
      uVar155 = auVar100._0_8_;
      register0x00001248 = uVar155;
      local_e0 = uVar155;
      register0x00001250 = uVar155;
      register0x00001258 = uVar155;
      auVar112 = vmulps_avx512vl(_local_e0,auVar116);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar117,local_c0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar121,local_a0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar119,local_80);
      auVar113 = vmulps_avx512vl(_local_e0,auVar106);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_c0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar105,local_a0);
      auVar29 = vfmadd231ps_fma(auVar113,auVar104,local_80);
      auVar113 = vmulps_avx512vl(auVar111,auVar111);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar110);
      auVar114 = vmaxps_avx512vl(auVar112,ZEXT1632(auVar29));
      auVar114 = vmulps_avx512vl(auVar114,auVar114);
      auVar113 = vmulps_avx512vl(auVar114,auVar113);
      auVar109 = vmulps_avx512vl(auVar109,auVar109);
      uVar155 = vcmpps_avx512vl(auVar109,auVar113,2);
      auVar100 = vblendps_avx(auVar24,auVar23,8);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar99 = vandps_avx512vl(auVar100,auVar101);
      auVar100 = vblendps_avx(auVar25,local_6e0,8);
      auVar100 = vandps_avx512vl(auVar100,auVar101);
      auVar99 = vmaxps_avx(auVar99,auVar100);
      auVar100 = vblendps_avx(auVar237,local_6f0,8);
      auVar102 = vandps_avx512vl(auVar100,auVar101);
      auVar100 = vblendps_avx(auVar26,_local_6d0,8);
      auVar100 = vandps_avx512vl(auVar100,auVar101);
      auVar100 = vmaxps_avx(auVar102,auVar100);
      auVar100 = vmaxps_avx(auVar99,auVar100);
      auVar99 = vmovshdup_avx(auVar100);
      auVar99 = vmaxss_avx(auVar99,auVar100);
      auVar100 = vshufpd_avx(auVar100,auVar100,1);
      auVar100 = vmaxss_avx(auVar100,auVar99);
      auVar99 = vcvtsi2ss_avx512f(_local_6d0,iVar9);
      auVar113._0_4_ = auVar99._0_4_;
      auVar113._4_4_ = auVar113._0_4_;
      auVar113._8_4_ = auVar113._0_4_;
      auVar113._12_4_ = auVar113._0_4_;
      auVar113._16_4_ = auVar113._0_4_;
      auVar113._20_4_ = auVar113._0_4_;
      auVar113._24_4_ = auVar113._0_4_;
      auVar113._28_4_ = auVar113._0_4_;
      uVar30 = vcmpps_avx512vl(auVar113,_DAT_02020f40,0xe);
      bVar93 = (byte)uVar155 & (byte)uVar30;
      auVar100 = vmulss_avx512f(auVar100,ZEXT416(0x35000000));
      auVar109._8_4_ = 2;
      auVar109._0_8_ = 0x200000002;
      auVar109._12_4_ = 2;
      auVar109._16_4_ = 2;
      auVar109._20_4_ = 2;
      auVar109._24_4_ = 2;
      auVar109._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar109,ZEXT1632(auVar24));
      local_120 = vpermps_avx512vl(auVar109,ZEXT1632(auVar25));
      local_140 = vpermps_avx512vl(auVar109,ZEXT1632(auVar237));
      auVar109 = vpermps_avx2(auVar109,ZEXT1632(auVar26));
      uVar90 = *(uint *)(ray + k * 4 + 0x60);
      auVar99 = local_120._0_16_;
      local_760 = auVar23._0_8_;
      uStack_758 = auVar23._8_8_;
      if (bVar93 == 0) {
        auVar99 = vxorps_avx512vl(auVar99,auVar99);
        auVar238 = ZEXT1664(auVar99);
        auVar236 = ZEXT3264(local_540);
        auVar235 = ZEXT3264(local_4c0);
        auVar239 = ZEXT3264(local_560);
        auVar240 = ZEXT3264(local_4e0);
        auVar241 = ZEXT3264(local_580);
        auVar242 = ZEXT3264(local_5a0);
      }
      else {
        local_5e0._0_16_ = ZEXT416(uVar90);
        auVar106 = vmulps_avx512vl(auVar109,auVar106);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_140,auVar106);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_120,auVar115);
        auVar114 = vfmadd213ps_avx512vl(auVar104,local_100,auVar105);
        auVar116 = vmulps_avx512vl(auVar109,auVar116);
        auVar117 = vfmadd213ps_avx512vl(auVar117,local_140,auVar116);
        auVar105 = vfmadd213ps_avx512vl(auVar121,local_120,auVar117);
        auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x1210);
        auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x1694);
        auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x1f9c);
        auVar118 = vfmadd213ps_avx512vl(auVar119,local_100,auVar105);
        auVar119 = vmulps_avx512vl(local_500,auVar104);
        auVar105 = vmulps_avx512vl(local_520,auVar104);
        auVar229._0_4_ = auVar109._0_4_ * auVar104._0_4_;
        auVar229._4_4_ = auVar109._4_4_ * auVar104._4_4_;
        auVar229._8_4_ = auVar109._8_4_ * auVar104._8_4_;
        auVar229._12_4_ = auVar109._12_4_ * auVar104._12_4_;
        auVar229._16_4_ = auVar109._16_4_ * auVar104._16_4_;
        auVar229._20_4_ = auVar109._20_4_ * auVar104._20_4_;
        auVar229._24_4_ = auVar109._24_4_ * auVar104._24_4_;
        auVar229._28_4_ = 0;
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,local_580);
        auVar104 = vfmadd231ps_avx512vl(auVar105,auVar116,local_5a0);
        auVar116 = vfmadd231ps_avx512vl(auVar229,local_140,auVar116);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar117,local_560);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar117,local_4e0);
        auVar105 = vfmadd231ps_avx512vl(auVar116,local_120,auVar117);
        auVar115 = vfmadd231ps_avx512vl(auVar119,auVar121,local_540);
        auVar235 = ZEXT3264(local_4c0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar121,local_4c0);
        auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x1210);
        auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x1b18);
        auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x1f9c);
        auVar105 = vfmadd231ps_avx512vl(auVar105,local_100,auVar121);
        auVar106 = vmulps_avx512vl(local_500,auVar116);
        auVar120 = vmulps_avx512vl(local_520,auVar116);
        auVar121._4_4_ = auVar109._4_4_ * auVar116._4_4_;
        auVar121._0_4_ = auVar109._0_4_ * auVar116._0_4_;
        auVar121._8_4_ = auVar109._8_4_ * auVar116._8_4_;
        auVar121._12_4_ = auVar109._12_4_ * auVar116._12_4_;
        auVar121._16_4_ = auVar109._16_4_ * auVar116._16_4_;
        auVar121._20_4_ = auVar109._20_4_ * auVar116._20_4_;
        auVar121._24_4_ = auVar109._24_4_ * auVar116._24_4_;
        auVar121._28_4_ = auVar116._28_4_;
        auVar116 = vfmadd231ps_avx512vl(auVar106,auVar117,local_580);
        auVar106 = vfmadd231ps_avx512vl(auVar120,auVar117,local_5a0);
        auVar117 = vfmadd231ps_avx512vl(auVar121,local_140,auVar117);
        auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x1694);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar121,local_560);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar121,local_4e0);
        auVar121 = vfmadd231ps_avx512vl(auVar117,local_120,auVar121);
        auVar117 = vfmadd231ps_avx512vl(auVar116,auVar119,local_540);
        auVar116 = vfmadd231ps_avx512vl(auVar106,auVar119,local_4c0);
        auVar106 = vfmadd231ps_avx512vl(auVar121,local_100,auVar119);
        auVar232._8_4_ = 0x7fffffff;
        auVar232._0_8_ = 0x7fffffff7fffffff;
        auVar232._12_4_ = 0x7fffffff;
        auVar232._16_4_ = 0x7fffffff;
        auVar232._20_4_ = 0x7fffffff;
        auVar232._24_4_ = 0x7fffffff;
        auVar232._28_4_ = 0x7fffffff;
        auVar119 = vandps_avx(auVar115,auVar232);
        auVar121 = vandps_avx(auVar104,auVar232);
        auVar121 = vmaxps_avx(auVar119,auVar121);
        auVar119 = vandps_avx(auVar105,auVar232);
        auVar119 = vmaxps_avx(auVar121,auVar119);
        auVar105 = vbroadcastss_avx512vl(auVar100);
        auVar245 = ZEXT1664(auVar100);
        uVar86 = vcmpps_avx512vl(auVar119,auVar105,1);
        bVar16 = (bool)((byte)uVar86 & 1);
        auVar120._0_4_ = (float)((uint)bVar16 * auVar110._0_4_ | (uint)!bVar16 * auVar115._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar16 * auVar110._4_4_ | (uint)!bVar16 * auVar115._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar16 * auVar110._8_4_ | (uint)!bVar16 * auVar115._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar16 * auVar110._12_4_ | (uint)!bVar16 * auVar115._12_4_);
        bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar16 * auVar110._16_4_ | (uint)!bVar16 * auVar115._16_4_);
        bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar16 * auVar110._20_4_ | (uint)!bVar16 * auVar115._20_4_);
        bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar16 * auVar110._24_4_ | (uint)!bVar16 * auVar115._24_4_);
        bVar16 = SUB81(uVar86 >> 7,0);
        auVar120._28_4_ = (uint)bVar16 * auVar110._28_4_ | (uint)!bVar16 * auVar115._28_4_;
        bVar16 = (bool)((byte)uVar86 & 1);
        auVar122._0_4_ = (float)((uint)bVar16 * auVar111._0_4_ | (uint)!bVar16 * auVar104._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar16 * auVar111._4_4_ | (uint)!bVar16 * auVar104._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar16 * auVar111._8_4_ | (uint)!bVar16 * auVar104._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar16 * auVar111._12_4_ | (uint)!bVar16 * auVar104._12_4_);
        bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar16 * auVar111._16_4_ | (uint)!bVar16 * auVar104._16_4_);
        bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar16 * auVar111._20_4_ | (uint)!bVar16 * auVar104._20_4_);
        bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar16 * auVar111._24_4_ | (uint)!bVar16 * auVar104._24_4_);
        bVar16 = SUB81(uVar86 >> 7,0);
        auVar122._28_4_ = (uint)bVar16 * auVar111._28_4_ | (uint)!bVar16 * auVar104._28_4_;
        auVar119 = vandps_avx(auVar232,auVar117);
        auVar121 = vandps_avx(auVar116,auVar232);
        auVar121 = vmaxps_avx(auVar119,auVar121);
        auVar119 = vandps_avx(auVar106,auVar232);
        auVar119 = vmaxps_avx(auVar121,auVar119);
        uVar86 = vcmpps_avx512vl(auVar119,auVar105,1);
        bVar16 = (bool)((byte)uVar86 & 1);
        auVar123._0_4_ = (float)((uint)bVar16 * auVar110._0_4_ | (uint)!bVar16 * auVar117._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar16 * auVar110._4_4_ | (uint)!bVar16 * auVar117._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar16 * auVar110._8_4_ | (uint)!bVar16 * auVar117._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar16 * auVar110._12_4_ | (uint)!bVar16 * auVar117._12_4_);
        bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar16 * auVar110._16_4_ | (uint)!bVar16 * auVar117._16_4_);
        bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar16 * auVar110._20_4_ | (uint)!bVar16 * auVar117._20_4_);
        bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar16 * auVar110._24_4_ | (uint)!bVar16 * auVar117._24_4_);
        bVar16 = SUB81(uVar86 >> 7,0);
        auVar123._28_4_ = (uint)bVar16 * auVar110._28_4_ | (uint)!bVar16 * auVar117._28_4_;
        bVar16 = (bool)((byte)uVar86 & 1);
        auVar124._0_4_ = (float)((uint)bVar16 * auVar111._0_4_ | (uint)!bVar16 * auVar116._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar16 * auVar111._4_4_ | (uint)!bVar16 * auVar116._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar16 * auVar111._8_4_ | (uint)!bVar16 * auVar116._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar16 * auVar111._12_4_ | (uint)!bVar16 * auVar116._12_4_);
        bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar16 * auVar111._16_4_ | (uint)!bVar16 * auVar116._16_4_);
        bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar16 * auVar111._20_4_ | (uint)!bVar16 * auVar116._20_4_);
        bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar16 * auVar111._24_4_ | (uint)!bVar16 * auVar116._24_4_);
        bVar16 = SUB81(uVar86 >> 7,0);
        auVar124._28_4_ = (uint)bVar16 * auVar111._28_4_ | (uint)!bVar16 * auVar116._28_4_;
        auVar103 = vxorps_avx512vl(auVar99,auVar99);
        auVar238 = ZEXT1664(auVar103);
        auVar119 = vfmadd213ps_avx512vl(auVar120,auVar120,ZEXT1632(auVar103));
        auVar99 = vfmadd231ps_fma(auVar119,auVar122,auVar122);
        auVar121 = vrsqrt14ps_avx512vl(ZEXT1632(auVar99));
        fVar193 = auVar121._0_4_;
        fVar202 = auVar121._4_4_;
        fVar203 = auVar121._8_4_;
        fVar204 = auVar121._12_4_;
        fVar184 = auVar121._16_4_;
        fVar192 = auVar121._20_4_;
        fVar94 = auVar121._24_4_;
        auVar119._4_4_ = fVar202 * fVar202 * fVar202 * auVar99._4_4_ * -0.5;
        auVar119._0_4_ = fVar193 * fVar193 * fVar193 * auVar99._0_4_ * -0.5;
        auVar119._8_4_ = fVar203 * fVar203 * fVar203 * auVar99._8_4_ * -0.5;
        auVar119._12_4_ = fVar204 * fVar204 * fVar204 * auVar99._12_4_ * -0.5;
        auVar119._16_4_ = fVar184 * fVar184 * fVar184 * -0.0;
        auVar119._20_4_ = fVar192 * fVar192 * fVar192 * -0.0;
        auVar119._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
        auVar119._28_4_ = auVar106._28_4_;
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar104,auVar121);
        auVar117._4_4_ = auVar122._4_4_ * auVar119._4_4_;
        auVar117._0_4_ = auVar122._0_4_ * auVar119._0_4_;
        auVar117._8_4_ = auVar122._8_4_ * auVar119._8_4_;
        auVar117._12_4_ = auVar122._12_4_ * auVar119._12_4_;
        auVar117._16_4_ = auVar122._16_4_ * auVar119._16_4_;
        auVar117._20_4_ = auVar122._20_4_ * auVar119._20_4_;
        auVar117._24_4_ = auVar122._24_4_ * auVar119._24_4_;
        auVar117._28_4_ = 0;
        auVar116._4_4_ = auVar119._4_4_ * -auVar120._4_4_;
        auVar116._0_4_ = auVar119._0_4_ * -auVar120._0_4_;
        auVar116._8_4_ = auVar119._8_4_ * -auVar120._8_4_;
        auVar116._12_4_ = auVar119._12_4_ * -auVar120._12_4_;
        auVar116._16_4_ = auVar119._16_4_ * -auVar120._16_4_;
        auVar116._20_4_ = auVar119._20_4_ * -auVar120._20_4_;
        auVar116._24_4_ = auVar119._24_4_ * -auVar120._24_4_;
        auVar116._28_4_ = auVar122._28_4_;
        auVar119 = vmulps_avx512vl(auVar119,ZEXT1632(auVar103));
        auVar110 = ZEXT1632(auVar103);
        auVar121 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar110);
        auVar99 = vfmadd231ps_fma(auVar121,auVar124,auVar124);
        auVar121 = vrsqrt14ps_avx512vl(ZEXT1632(auVar99));
        fVar193 = auVar121._0_4_;
        fVar202 = auVar121._4_4_;
        fVar203 = auVar121._8_4_;
        fVar204 = auVar121._12_4_;
        fVar184 = auVar121._16_4_;
        fVar192 = auVar121._20_4_;
        fVar94 = auVar121._24_4_;
        auVar105._4_4_ = fVar202 * fVar202 * fVar202 * auVar99._4_4_ * -0.5;
        auVar105._0_4_ = fVar193 * fVar193 * fVar193 * auVar99._0_4_ * -0.5;
        auVar105._8_4_ = fVar203 * fVar203 * fVar203 * auVar99._8_4_ * -0.5;
        auVar105._12_4_ = fVar204 * fVar204 * fVar204 * auVar99._12_4_ * -0.5;
        auVar105._16_4_ = fVar184 * fVar184 * fVar184 * -0.0;
        auVar105._20_4_ = fVar192 * fVar192 * fVar192 * -0.0;
        auVar105._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
        auVar105._28_4_ = 0;
        auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar121);
        auVar115._4_4_ = auVar124._4_4_ * auVar104._4_4_;
        auVar115._0_4_ = auVar124._0_4_ * auVar104._0_4_;
        auVar115._8_4_ = auVar124._8_4_ * auVar104._8_4_;
        auVar115._12_4_ = auVar124._12_4_ * auVar104._12_4_;
        auVar115._16_4_ = auVar124._16_4_ * auVar104._16_4_;
        auVar115._20_4_ = auVar124._20_4_ * auVar104._20_4_;
        auVar115._24_4_ = auVar124._24_4_ * auVar104._24_4_;
        auVar115._28_4_ = auVar121._28_4_;
        auVar106._4_4_ = -auVar123._4_4_ * auVar104._4_4_;
        auVar106._0_4_ = -auVar123._0_4_ * auVar104._0_4_;
        auVar106._8_4_ = -auVar123._8_4_ * auVar104._8_4_;
        auVar106._12_4_ = -auVar123._12_4_ * auVar104._12_4_;
        auVar106._16_4_ = -auVar123._16_4_ * auVar104._16_4_;
        auVar106._20_4_ = -auVar123._20_4_ * auVar104._20_4_;
        auVar106._24_4_ = -auVar123._24_4_ * auVar104._24_4_;
        auVar106._28_4_ = auVar123._28_4_ ^ 0x80000000;
        auVar121 = vmulps_avx512vl(auVar104,auVar110);
        auVar99 = vfmadd213ps_fma(auVar117,auVar112,auVar107);
        auVar237 = vfmadd213ps_fma(auVar116,auVar112,auVar108);
        auVar104 = vfmadd213ps_avx512vl(auVar119,auVar112,auVar118);
        auVar105 = vfmadd213ps_avx512vl(auVar115,ZEXT1632(auVar29),ZEXT1632(auVar27));
        auVar101 = vfnmadd213ps_fma(auVar117,auVar112,auVar107);
        auVar107 = ZEXT1632(auVar29);
        auVar24 = vfmadd213ps_fma(auVar106,auVar107,ZEXT1632(auVar28));
        auVar102 = vfnmadd213ps_fma(auVar116,auVar112,auVar108);
        auVar25 = vfmadd213ps_fma(auVar121,auVar107,auVar114);
        auVar117 = vfnmadd231ps_avx512vl(auVar118,auVar112,auVar119);
        auVar33 = vfnmadd213ps_fma(auVar115,auVar107,ZEXT1632(auVar27));
        auVar28 = vfnmadd213ps_fma(auVar106,auVar107,ZEXT1632(auVar28));
        auVar34 = vfnmadd231ps_fma(auVar114,ZEXT1632(auVar29),auVar121);
        auVar121 = vsubps_avx512vl(auVar105,ZEXT1632(auVar101));
        auVar119 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar102));
        auVar116 = vsubps_avx512vl(ZEXT1632(auVar25),auVar117);
        auVar115 = vmulps_avx512vl(auVar119,auVar117);
        auVar26 = vfmsub231ps_fma(auVar115,ZEXT1632(auVar102),auVar116);
        auVar107._4_4_ = auVar101._4_4_ * auVar116._4_4_;
        auVar107._0_4_ = auVar101._0_4_ * auVar116._0_4_;
        auVar107._8_4_ = auVar101._8_4_ * auVar116._8_4_;
        auVar107._12_4_ = auVar101._12_4_ * auVar116._12_4_;
        auVar107._16_4_ = auVar116._16_4_ * 0.0;
        auVar107._20_4_ = auVar116._20_4_ * 0.0;
        auVar107._24_4_ = auVar116._24_4_ * 0.0;
        auVar107._28_4_ = auVar116._28_4_;
        auVar116 = vfmsub231ps_avx512vl(auVar107,auVar117,auVar121);
        auVar108._4_4_ = auVar102._4_4_ * auVar121._4_4_;
        auVar108._0_4_ = auVar102._0_4_ * auVar121._0_4_;
        auVar108._8_4_ = auVar102._8_4_ * auVar121._8_4_;
        auVar108._12_4_ = auVar102._12_4_ * auVar121._12_4_;
        auVar108._16_4_ = auVar121._16_4_ * 0.0;
        auVar108._20_4_ = auVar121._20_4_ * 0.0;
        auVar108._24_4_ = auVar121._24_4_ * 0.0;
        auVar108._28_4_ = auVar121._28_4_;
        auVar27 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar101),auVar119);
        auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar27),auVar110,auVar116);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar110,ZEXT1632(auVar26));
        auVar120 = ZEXT1632(auVar103);
        uVar86 = vcmpps_avx512vl(auVar119,auVar120,2);
        bVar85 = (byte)uVar86;
        fVar94 = (float)((uint)(bVar85 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar33._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        fVar145 = (float)((uint)bVar16 * auVar99._4_4_ | (uint)!bVar16 * auVar33._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        fVar147 = (float)((uint)bVar16 * auVar99._8_4_ | (uint)!bVar16 * auVar33._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        fVar150 = (float)((uint)bVar16 * auVar99._12_4_ | (uint)!bVar16 * auVar33._12_4_);
        auVar115 = ZEXT1632(CONCAT412(fVar150,CONCAT48(fVar147,CONCAT44(fVar145,fVar94))));
        fVar95 = (float)((uint)(bVar85 & 1) * auVar237._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar28._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        fVar146 = (float)((uint)bVar16 * auVar237._4_4_ | (uint)!bVar16 * auVar28._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        fVar148 = (float)((uint)bVar16 * auVar237._8_4_ | (uint)!bVar16 * auVar28._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        fVar151 = (float)((uint)bVar16 * auVar237._12_4_ | (uint)!bVar16 * auVar28._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar148,CONCAT44(fVar146,fVar95))));
        auVar118._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar34._0_4_
                    );
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar34._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar34._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar34._12_4_);
        fVar202 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar104._16_4_);
        auVar118._16_4_ = fVar202;
        fVar193 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar104._20_4_);
        auVar118._20_4_ = fVar193;
        fVar203 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar104._24_4_);
        auVar118._24_4_ = fVar203;
        iVar1 = (uint)(byte)(uVar86 >> 7) * auVar104._28_4_;
        auVar118._28_4_ = iVar1;
        auVar121 = vblendmps_avx512vl(ZEXT1632(auVar101),auVar105);
        auVar125._0_4_ =
             (uint)(bVar85 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar26._0_4_;
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar16 * auVar121._4_4_ | (uint)!bVar16 * auVar26._4_4_;
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar16 * auVar121._8_4_ | (uint)!bVar16 * auVar26._8_4_;
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar16 * auVar121._12_4_ | (uint)!bVar16 * auVar26._12_4_;
        auVar125._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar121._16_4_;
        auVar125._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar121._20_4_;
        auVar125._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar121._24_4_;
        auVar125._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar121._28_4_;
        auVar121 = vblendmps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar24));
        auVar126._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar121._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar237._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar16 * auVar121._4_4_ | (uint)!bVar16 * auVar237._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar16 * auVar121._8_4_ | (uint)!bVar16 * auVar237._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar16 * auVar121._12_4_ | (uint)!bVar16 * auVar237._12_4_);
        fVar204 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar121._16_4_);
        auVar126._16_4_ = fVar204;
        fVar184 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar121._20_4_);
        auVar126._20_4_ = fVar184;
        fVar192 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar121._24_4_);
        auVar126._24_4_ = fVar192;
        auVar126._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar121._28_4_;
        auVar121 = vblendmps_avx512vl(auVar117,ZEXT1632(auVar25));
        auVar127._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar121._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar104._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar16 * auVar121._4_4_ | (uint)!bVar16 * auVar104._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar16 * auVar121._8_4_ | (uint)!bVar16 * auVar104._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar16 * auVar121._12_4_ | (uint)!bVar16 * auVar104._12_4_);
        bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar16 * auVar121._16_4_ | (uint)!bVar16 * auVar104._16_4_);
        bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar16 * auVar121._20_4_ | (uint)!bVar16 * auVar104._20_4_);
        bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar16 * auVar121._24_4_ | (uint)!bVar16 * auVar104._24_4_);
        bVar16 = SUB81(uVar86 >> 7,0);
        auVar127._28_4_ = (uint)bVar16 * auVar121._28_4_ | (uint)!bVar16 * auVar104._28_4_;
        auVar128._0_4_ =
             (uint)(bVar85 & 1) * (int)auVar101._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar105._0_4_;
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar16 * (int)auVar101._4_4_ | (uint)!bVar16 * auVar105._4_4_;
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar16 * (int)auVar101._8_4_ | (uint)!bVar16 * auVar105._8_4_;
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar16 * (int)auVar101._12_4_ | (uint)!bVar16 * auVar105._12_4_;
        auVar128._16_4_ = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * auVar105._16_4_;
        auVar128._20_4_ = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * auVar105._20_4_;
        auVar128._24_4_ = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * auVar105._24_4_;
        auVar128._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar105._28_4_;
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar129._0_4_ =
             (uint)(bVar85 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar25._0_4_;
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar17 * auVar117._4_4_ | (uint)!bVar17 * auVar25._4_4_;
        bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar17 * auVar117._8_4_ | (uint)!bVar17 * auVar25._8_4_;
        bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar17 * auVar117._12_4_ | (uint)!bVar17 * auVar25._12_4_;
        auVar129._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar117._16_4_;
        auVar129._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar117._20_4_;
        auVar129._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar117._24_4_;
        iVar2 = (uint)(byte)(uVar86 >> 7) * auVar117._28_4_;
        auVar129._28_4_ = iVar2;
        auVar107 = vsubps_avx512vl(auVar128,auVar115);
        auVar121 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar102._12_4_ |
                                                 (uint)!bVar19 * auVar24._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar102._8_4_ |
                                                          (uint)!bVar18 * auVar24._8_4_,
                                                          CONCAT44((uint)bVar16 *
                                                                   (int)auVar102._4_4_ |
                                                                   (uint)!bVar16 * auVar24._4_4_,
                                                                   (uint)(bVar85 & 1) *
                                                                   (int)auVar102._0_4_ |
                                                                   (uint)!(bool)(bVar85 & 1) *
                                                                   auVar24._0_4_)))),auVar106);
        auVar117 = vsubps_avx(auVar129,auVar118);
        auVar116 = vsubps_avx(auVar115,auVar125);
        auVar104 = vsubps_avx(auVar106,auVar126);
        auVar105 = vsubps_avx(auVar118,auVar127);
        auVar110._4_4_ = auVar117._4_4_ * fVar145;
        auVar110._0_4_ = auVar117._0_4_ * fVar94;
        auVar110._8_4_ = auVar117._8_4_ * fVar147;
        auVar110._12_4_ = auVar117._12_4_ * fVar150;
        auVar110._16_4_ = auVar117._16_4_ * 0.0;
        auVar110._20_4_ = auVar117._20_4_ * 0.0;
        auVar110._24_4_ = auVar117._24_4_ * 0.0;
        auVar110._28_4_ = iVar2;
        auVar99 = vfmsub231ps_fma(auVar110,auVar118,auVar107);
        auVar111._4_4_ = fVar146 * auVar107._4_4_;
        auVar111._0_4_ = fVar95 * auVar107._0_4_;
        auVar111._8_4_ = fVar148 * auVar107._8_4_;
        auVar111._12_4_ = fVar151 * auVar107._12_4_;
        auVar111._16_4_ = auVar107._16_4_ * 0.0;
        auVar111._20_4_ = auVar107._20_4_ * 0.0;
        auVar111._24_4_ = auVar107._24_4_ * 0.0;
        auVar111._28_4_ = auVar119._28_4_;
        auVar237 = vfmsub231ps_fma(auVar111,auVar115,auVar121);
        auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar237),auVar120,ZEXT1632(auVar99));
        auVar196._0_4_ = auVar121._0_4_ * auVar118._0_4_;
        auVar196._4_4_ = auVar121._4_4_ * auVar118._4_4_;
        auVar196._8_4_ = auVar121._8_4_ * auVar118._8_4_;
        auVar196._12_4_ = auVar121._12_4_ * auVar118._12_4_;
        auVar196._16_4_ = auVar121._16_4_ * fVar202;
        auVar196._20_4_ = auVar121._20_4_ * fVar193;
        auVar196._24_4_ = auVar121._24_4_ * fVar203;
        auVar196._28_4_ = 0;
        auVar99 = vfmsub231ps_fma(auVar196,auVar106,auVar117);
        auVar108 = vfmadd231ps_avx512vl(auVar119,auVar120,ZEXT1632(auVar99));
        auVar119 = vmulps_avx512vl(auVar105,auVar125);
        auVar119 = vfmsub231ps_avx512vl(auVar119,auVar116,auVar127);
        auVar114._4_4_ = auVar104._4_4_ * auVar127._4_4_;
        auVar114._0_4_ = auVar104._0_4_ * auVar127._0_4_;
        auVar114._8_4_ = auVar104._8_4_ * auVar127._8_4_;
        auVar114._12_4_ = auVar104._12_4_ * auVar127._12_4_;
        auVar114._16_4_ = auVar104._16_4_ * auVar127._16_4_;
        auVar114._20_4_ = auVar104._20_4_ * auVar127._20_4_;
        auVar114._24_4_ = auVar104._24_4_ * auVar127._24_4_;
        auVar114._28_4_ = auVar127._28_4_;
        auVar99 = vfmsub231ps_fma(auVar114,auVar126,auVar105);
        auVar197._0_4_ = auVar126._0_4_ * auVar116._0_4_;
        auVar197._4_4_ = auVar126._4_4_ * auVar116._4_4_;
        auVar197._8_4_ = auVar126._8_4_ * auVar116._8_4_;
        auVar197._12_4_ = auVar126._12_4_ * auVar116._12_4_;
        auVar197._16_4_ = fVar204 * auVar116._16_4_;
        auVar197._20_4_ = fVar184 * auVar116._20_4_;
        auVar197._24_4_ = fVar192 * auVar116._24_4_;
        auVar197._28_4_ = 0;
        auVar237 = vfmsub231ps_fma(auVar197,auVar104,auVar125);
        auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar237),auVar120,auVar119);
        auVar110 = vfmadd231ps_avx512vl(auVar119,auVar120,ZEXT1632(auVar99));
        auVar119 = vmaxps_avx(auVar108,auVar110);
        uVar155 = vcmpps_avx512vl(auVar119,auVar120,2);
        bVar93 = bVar93 & (byte)uVar155;
        auVar236 = ZEXT3264(local_540);
        auVar239 = ZEXT3264(local_560);
        auVar240 = ZEXT3264(local_4e0);
        auVar241 = ZEXT3264(local_580);
        auVar242 = ZEXT3264(local_5a0);
        auVar243 = ZEXT3264(local_500);
        if (bVar93 == 0) {
          bVar93 = 0;
        }
        else {
          auVar46._4_4_ = auVar105._4_4_ * auVar121._4_4_;
          auVar46._0_4_ = auVar105._0_4_ * auVar121._0_4_;
          auVar46._8_4_ = auVar105._8_4_ * auVar121._8_4_;
          auVar46._12_4_ = auVar105._12_4_ * auVar121._12_4_;
          auVar46._16_4_ = auVar105._16_4_ * auVar121._16_4_;
          auVar46._20_4_ = auVar105._20_4_ * auVar121._20_4_;
          auVar46._24_4_ = auVar105._24_4_ * auVar121._24_4_;
          auVar46._28_4_ = auVar119._28_4_;
          auVar24 = vfmsub231ps_fma(auVar46,auVar104,auVar117);
          auVar47._4_4_ = auVar117._4_4_ * auVar116._4_4_;
          auVar47._0_4_ = auVar117._0_4_ * auVar116._0_4_;
          auVar47._8_4_ = auVar117._8_4_ * auVar116._8_4_;
          auVar47._12_4_ = auVar117._12_4_ * auVar116._12_4_;
          auVar47._16_4_ = auVar117._16_4_ * auVar116._16_4_;
          auVar47._20_4_ = auVar117._20_4_ * auVar116._20_4_;
          auVar47._24_4_ = auVar117._24_4_ * auVar116._24_4_;
          auVar47._28_4_ = auVar117._28_4_;
          auVar237 = vfmsub231ps_fma(auVar47,auVar107,auVar105);
          auVar48._4_4_ = auVar104._4_4_ * auVar107._4_4_;
          auVar48._0_4_ = auVar104._0_4_ * auVar107._0_4_;
          auVar48._8_4_ = auVar104._8_4_ * auVar107._8_4_;
          auVar48._12_4_ = auVar104._12_4_ * auVar107._12_4_;
          auVar48._16_4_ = auVar104._16_4_ * auVar107._16_4_;
          auVar48._20_4_ = auVar104._20_4_ * auVar107._20_4_;
          auVar48._24_4_ = auVar104._24_4_ * auVar107._24_4_;
          auVar48._28_4_ = auVar104._28_4_;
          auVar25 = vfmsub231ps_fma(auVar48,auVar116,auVar121);
          auVar99 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar237),ZEXT1632(auVar25));
          auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar24),auVar120);
          auVar121 = vrcp14ps_avx512vl(auVar119);
          auVar37._8_4_ = 0x3f800000;
          auVar37._0_8_ = &DAT_3f8000003f800000;
          auVar37._12_4_ = 0x3f800000;
          auVar37._16_4_ = 0x3f800000;
          auVar37._20_4_ = 0x3f800000;
          auVar37._24_4_ = 0x3f800000;
          auVar37._28_4_ = 0x3f800000;
          auVar117 = vfnmadd213ps_avx512vl(auVar121,auVar119,auVar37);
          auVar99 = vfmadd132ps_fma(auVar117,auVar121,auVar121);
          auVar49._4_4_ = auVar25._4_4_ * auVar118._4_4_;
          auVar49._0_4_ = auVar25._0_4_ * auVar118._0_4_;
          auVar49._8_4_ = auVar25._8_4_ * auVar118._8_4_;
          auVar49._12_4_ = auVar25._12_4_ * auVar118._12_4_;
          auVar49._16_4_ = fVar202 * 0.0;
          auVar49._20_4_ = fVar193 * 0.0;
          auVar49._24_4_ = fVar203 * 0.0;
          auVar49._28_4_ = iVar1;
          auVar237 = vfmadd231ps_fma(auVar49,auVar106,ZEXT1632(auVar237));
          auVar237 = vfmadd231ps_fma(ZEXT1632(auVar237),auVar115,ZEXT1632(auVar24));
          fVar193 = auVar99._0_4_;
          fVar202 = auVar99._4_4_;
          fVar203 = auVar99._8_4_;
          fVar204 = auVar99._12_4_;
          auVar121 = ZEXT1632(CONCAT412(auVar237._12_4_ * fVar204,
                                        CONCAT48(auVar237._8_4_ * fVar203,
                                                 CONCAT44(auVar237._4_4_ * fVar202,
                                                          auVar237._0_4_ * fVar193))));
          auVar220._4_4_ = uVar90;
          auVar220._0_4_ = uVar90;
          auVar220._8_4_ = uVar90;
          auVar220._12_4_ = uVar90;
          auVar220._16_4_ = uVar90;
          auVar220._20_4_ = uVar90;
          auVar220._24_4_ = uVar90;
          auVar220._28_4_ = uVar90;
          uVar155 = vcmpps_avx512vl(auVar220,auVar121,2);
          uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar38._4_4_ = uVar154;
          auVar38._0_4_ = uVar154;
          auVar38._8_4_ = uVar154;
          auVar38._12_4_ = uVar154;
          auVar38._16_4_ = uVar154;
          auVar38._20_4_ = uVar154;
          auVar38._24_4_ = uVar154;
          auVar38._28_4_ = uVar154;
          uVar30 = vcmpps_avx512vl(auVar121,auVar38,2);
          bVar93 = (byte)uVar155 & (byte)uVar30 & bVar93;
          if (bVar93 != 0) {
            uVar155 = vcmpps_avx512vl(auVar119,auVar120,4);
            if ((bVar93 & (byte)uVar155) != 0) {
              bVar93 = bVar93 & (byte)uVar155;
              fVar184 = auVar108._0_4_ * fVar193;
              fVar192 = auVar108._4_4_ * fVar202;
              auVar50._4_4_ = fVar192;
              auVar50._0_4_ = fVar184;
              fVar94 = auVar108._8_4_ * fVar203;
              auVar50._8_4_ = fVar94;
              fVar95 = auVar108._12_4_ * fVar204;
              auVar50._12_4_ = fVar95;
              fVar145 = auVar108._16_4_ * 0.0;
              auVar50._16_4_ = fVar145;
              fVar146 = auVar108._20_4_ * 0.0;
              auVar50._20_4_ = fVar146;
              fVar147 = auVar108._24_4_ * 0.0;
              auVar50._24_4_ = fVar147;
              auVar50._28_4_ = auVar108._28_4_;
              fVar193 = auVar110._0_4_ * fVar193;
              fVar202 = auVar110._4_4_ * fVar202;
              auVar51._4_4_ = fVar202;
              auVar51._0_4_ = fVar193;
              fVar203 = auVar110._8_4_ * fVar203;
              auVar51._8_4_ = fVar203;
              fVar204 = auVar110._12_4_ * fVar204;
              auVar51._12_4_ = fVar204;
              fVar148 = auVar110._16_4_ * 0.0;
              auVar51._16_4_ = fVar148;
              fVar150 = auVar110._20_4_ * 0.0;
              auVar51._20_4_ = fVar150;
              fVar151 = auVar110._24_4_ * 0.0;
              auVar51._24_4_ = fVar151;
              auVar51._28_4_ = auVar110._28_4_;
              auVar212._8_4_ = 0x3f800000;
              auVar212._0_8_ = &DAT_3f8000003f800000;
              auVar212._12_4_ = 0x3f800000;
              auVar212._16_4_ = 0x3f800000;
              auVar212._20_4_ = 0x3f800000;
              auVar212._24_4_ = 0x3f800000;
              auVar212._28_4_ = 0x3f800000;
              auVar119 = vsubps_avx(auVar212,auVar50);
              local_660._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar184 | (uint)!(bool)(bVar85 & 1) * auVar119._0_4_;
              bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
              local_660._4_4_ = (uint)bVar16 * (int)fVar192 | (uint)!bVar16 * auVar119._4_4_;
              bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
              local_660._8_4_ = (uint)bVar16 * (int)fVar94 | (uint)!bVar16 * auVar119._8_4_;
              bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
              local_660._12_4_ = (uint)bVar16 * (int)fVar95 | (uint)!bVar16 * auVar119._12_4_;
              bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
              local_660._16_4_ = (uint)bVar16 * (int)fVar145 | (uint)!bVar16 * auVar119._16_4_;
              bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
              local_660._20_4_ = (uint)bVar16 * (int)fVar146 | (uint)!bVar16 * auVar119._20_4_;
              bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
              local_660._24_4_ = (uint)bVar16 * (int)fVar147 | (uint)!bVar16 * auVar119._24_4_;
              bVar16 = SUB81(uVar86 >> 7,0);
              local_660._28_4_ = (uint)bVar16 * auVar108._28_4_ | (uint)!bVar16 * auVar119._28_4_;
              auVar119 = vsubps_avx(auVar212,auVar51);
              bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar86 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar86 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar86 >> 6) & 1);
              bVar22 = SUB81(uVar86 >> 7,0);
              local_2e0._4_4_ = (uint)bVar16 * (int)fVar202 | (uint)!bVar16 * auVar119._4_4_;
              local_2e0._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar193 | (uint)!(bool)(bVar85 & 1) * auVar119._0_4_;
              local_2e0._8_4_ = (uint)bVar17 * (int)fVar203 | (uint)!bVar17 * auVar119._8_4_;
              local_2e0._12_4_ = (uint)bVar18 * (int)fVar204 | (uint)!bVar18 * auVar119._12_4_;
              local_2e0._16_4_ = (uint)bVar19 * (int)fVar148 | (uint)!bVar19 * auVar119._16_4_;
              local_2e0._20_4_ = (uint)bVar20 * (int)fVar150 | (uint)!bVar20 * auVar119._20_4_;
              local_2e0._24_4_ = (uint)bVar21 * (int)fVar151 | (uint)!bVar21 * auVar119._24_4_;
              local_2e0._28_4_ = (uint)bVar22 * auVar110._28_4_ | (uint)!bVar22 * auVar119._28_4_;
              local_680 = auVar121;
              goto LAB_01c86078;
            }
          }
          bVar93 = 0;
        }
LAB_01c86078:
        auVar234 = ZEXT3264(auVar109);
        if (bVar93 != 0) {
          auVar119 = vsubps_avx(ZEXT1632(auVar29),auVar112);
          auVar99 = vfmadd213ps_fma(auVar119,local_660,auVar112);
          uVar154 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar112._4_4_ = uVar154;
          auVar112._0_4_ = uVar154;
          auVar112._8_4_ = uVar154;
          auVar112._12_4_ = uVar154;
          auVar112._16_4_ = uVar154;
          auVar112._20_4_ = uVar154;
          auVar112._24_4_ = uVar154;
          auVar112._28_4_ = uVar154;
          auVar119 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar99._12_4_ + auVar99._12_4_,
                                                        CONCAT48(auVar99._8_4_ + auVar99._8_4_,
                                                                 CONCAT44(auVar99._4_4_ +
                                                                          auVar99._4_4_,
                                                                          auVar99._0_4_ +
                                                                          auVar99._0_4_)))),auVar112
                                    );
          uVar155 = vcmpps_avx512vl(local_680,auVar119,6);
          bVar93 = bVar93 & (byte)uVar155;
          if (bVar93 != 0) {
            auVar164._8_4_ = 0xbf800000;
            auVar164._0_8_ = 0xbf800000bf800000;
            auVar164._12_4_ = 0xbf800000;
            auVar164._16_4_ = 0xbf800000;
            auVar164._20_4_ = 0xbf800000;
            auVar164._24_4_ = 0xbf800000;
            auVar164._28_4_ = 0xbf800000;
            auVar39._8_4_ = 0x40000000;
            auVar39._0_8_ = 0x4000000040000000;
            auVar39._12_4_ = 0x40000000;
            auVar39._16_4_ = 0x40000000;
            auVar39._20_4_ = 0x40000000;
            auVar39._24_4_ = 0x40000000;
            auVar39._28_4_ = 0x40000000;
            local_460 = vfmadd132ps_avx512vl(local_2e0,auVar164,auVar39);
            local_2e0 = local_460;
            auVar119 = local_2e0;
            local_420 = 0;
            local_410 = local_760;
            uStack_408 = uStack_758;
            local_400 = local_6e0._0_8_;
            uStack_3f8 = local_6e0._8_8_;
            local_3f0 = local_6f0._0_8_;
            uStack_3e8 = local_6f0._8_8_;
            local_3e0 = local_6d0;
            uStack_3d8 = uStack_6c8;
            local_2e0 = auVar119;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar193 = 1.0 / auVar113._0_4_;
              local_3c0[0] = fVar193 * (local_660._0_4_ + 0.0);
              local_3c0[1] = fVar193 * (local_660._4_4_ + 1.0);
              local_3c0[2] = fVar193 * (local_660._8_4_ + 2.0);
              local_3c0[3] = fVar193 * (local_660._12_4_ + 3.0);
              fStack_3b0 = fVar193 * (local_660._16_4_ + 4.0);
              fStack_3ac = fVar193 * (local_660._20_4_ + 5.0);
              fStack_3a8 = fVar193 * (local_660._24_4_ + 6.0);
              fStack_3a4 = local_660._28_4_ + 7.0;
              local_2e0._0_8_ = local_460._0_8_;
              local_2e0._8_8_ = local_460._8_8_;
              local_2e0._16_8_ = local_460._16_8_;
              local_2e0._24_8_ = local_460._24_8_;
              local_3a0 = local_2e0._0_8_;
              uStack_398 = local_2e0._8_8_;
              uStack_390 = local_2e0._16_8_;
              uStack_388 = local_2e0._24_8_;
              local_380 = local_680;
              auVar165._8_4_ = 0x7f800000;
              auVar165._0_8_ = 0x7f8000007f800000;
              auVar165._12_4_ = 0x7f800000;
              auVar165._16_4_ = 0x7f800000;
              auVar165._20_4_ = 0x7f800000;
              auVar165._24_4_ = 0x7f800000;
              auVar165._28_4_ = 0x7f800000;
              auVar119 = vblendmps_avx512vl(auVar165,local_680);
              auVar130._0_4_ =
                   (uint)(bVar93 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar93 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar93 >> 1 & 1);
              auVar130._4_4_ = (uint)bVar16 * auVar119._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar93 >> 2 & 1);
              auVar130._8_4_ = (uint)bVar16 * auVar119._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar93 >> 3 & 1);
              auVar130._12_4_ = (uint)bVar16 * auVar119._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar93 >> 4 & 1);
              auVar130._16_4_ = (uint)bVar16 * auVar119._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar93 >> 5 & 1);
              auVar130._20_4_ = (uint)bVar16 * auVar119._20_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar93 >> 6 & 1);
              auVar130._24_4_ = (uint)bVar16 * auVar119._24_4_ | (uint)!bVar16 * 0x7f800000;
              auVar130._28_4_ =
                   (uint)(bVar93 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
              auVar119 = vshufps_avx(auVar130,auVar130,0xb1);
              auVar119 = vminps_avx(auVar130,auVar119);
              auVar121 = vshufpd_avx(auVar119,auVar119,5);
              auVar119 = vminps_avx(auVar119,auVar121);
              auVar121 = vpermpd_avx2(auVar119,0x4e);
              auVar119 = vminps_avx(auVar119,auVar121);
              uVar155 = vcmpps_avx512vl(auVar130,auVar119,0);
              bVar84 = (byte)uVar155 & bVar93;
              bVar85 = bVar93;
              if (bVar84 != 0) {
                bVar85 = bVar84;
              }
              uVar88 = 0;
              for (uVar87 = (uint)bVar85; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                uVar88 = uVar88 + 1;
              }
              uVar86 = (ulong)uVar88;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar193 = local_3c0[uVar86];
                uVar154 = *(undefined4 *)((long)&local_3a0 + uVar86 * 4);
                fVar203 = 1.0 - fVar193;
                fVar202 = fVar203 * fVar203 * -3.0;
                auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * fVar203)),
                                          ZEXT416((uint)(fVar193 * fVar203)),ZEXT416(0xc0000000));
                auVar237 = vfmsub132ss_fma(ZEXT416((uint)(fVar193 * fVar203)),
                                           ZEXT416((uint)(fVar193 * fVar193)),ZEXT416(0x40000000));
                fVar203 = auVar99._0_4_ * 3.0;
                fVar204 = auVar237._0_4_ * 3.0;
                fVar184 = fVar193 * fVar193 * 3.0;
                auVar208._0_4_ = fVar184 * (float)local_6d0._0_4_;
                auVar208._4_4_ = fVar184 * (float)local_6d0._4_4_;
                auVar208._8_4_ = fVar184 * (float)uStack_6c8;
                auVar208._12_4_ = fVar184 * uStack_6c8._4_4_;
                auVar180._4_4_ = fVar204;
                auVar180._0_4_ = fVar204;
                auVar180._8_4_ = fVar204;
                auVar180._12_4_ = fVar204;
                auVar99 = vfmadd132ps_fma(auVar180,auVar208,local_6f0);
                auVar187._4_4_ = fVar203;
                auVar187._0_4_ = fVar203;
                auVar187._8_4_ = fVar203;
                auVar187._12_4_ = fVar203;
                auVar99 = vfmadd132ps_fma(auVar187,auVar99,local_6e0);
                auVar181._4_4_ = fVar202;
                auVar181._0_4_ = fVar202;
                auVar181._8_4_ = fVar202;
                auVar181._12_4_ = fVar202;
                auVar99 = vfmadd132ps_fma(auVar181,auVar99,auVar23);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_380 + uVar86 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar99._0_4_;
                uVar10 = vextractps_avx(auVar99,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                uVar10 = vextractps_avx(auVar99,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                *(float *)(ray + k * 4 + 0x1e0) = fVar193;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar154;
                *(uint *)(ray + k * 4 + 0x220) = uVar8;
                *(uint *)(ray + k * 4 + 0x240) = uVar7;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_340 = vpbroadcastd_avx512vl();
                local_360 = vpbroadcastd_avx512vl();
                local_700 = local_6e0._0_4_;
                uStack_6fc = local_6e0._4_4_;
                uStack_6f8 = local_6e0._8_8_;
                local_600 = local_6f0._0_4_;
                uStack_5fc = local_6f0._4_4_;
                uStack_5f8 = local_6f0._8_8_;
                local_710 = auVar100;
                local_610 = (float)local_6d0._0_4_;
                fStack_60c = (float)local_6d0._4_4_;
                fStack_608 = (float)uStack_6c8;
                fStack_604 = uStack_6c8._4_4_;
                local_5c0 = auVar109;
                local_480 = local_660;
                local_440 = local_680;
                local_41c = iVar9;
                local_3d0 = bVar93;
                do {
                  auVar237 = auVar238._0_16_;
                  local_320 = (float)*(undefined4 *)(ray + k * 4 + 0x100);
                  local_200 = local_3c0[uVar86];
                  local_1e0 = *(undefined4 *)((long)&local_3a0 + uVar86 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_380 + uVar86 * 4);
                  local_748.context = context->user;
                  fVar202 = 1.0 - local_200;
                  fVar193 = fVar202 * fVar202 * -3.0;
                  auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * fVar202)),
                                             ZEXT416((uint)(local_200 * fVar202)),
                                             ZEXT416(0xc0000000));
                  auVar99 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar202)),
                                            ZEXT416((uint)(local_200 * local_200)),
                                            ZEXT416(0x40000000));
                  fVar202 = auVar100._0_4_ * 3.0;
                  fVar203 = auVar99._0_4_ * 3.0;
                  fVar204 = local_200 * local_200 * 3.0;
                  auVar211._0_4_ = fVar204 * local_610;
                  auVar211._4_4_ = fVar204 * fStack_60c;
                  auVar211._8_4_ = fVar204 * fStack_608;
                  auVar211._12_4_ = fVar204 * fStack_604;
                  auVar162._4_4_ = fVar203;
                  auVar162._0_4_ = fVar203;
                  auVar162._8_4_ = fVar203;
                  auVar162._12_4_ = fVar203;
                  auVar82._4_4_ = uStack_5fc;
                  auVar82._0_4_ = local_600;
                  auVar82._8_8_ = uStack_5f8;
                  auVar100 = vfmadd132ps_fma(auVar162,auVar211,auVar82);
                  auVar190._4_4_ = fVar202;
                  auVar190._0_4_ = fVar202;
                  auVar190._8_4_ = fVar202;
                  auVar190._12_4_ = fVar202;
                  auVar76._4_4_ = uStack_6fc;
                  auVar76._0_4_ = local_700;
                  auVar76._8_8_ = uStack_6f8;
                  auVar100 = vfmadd132ps_fma(auVar190,auVar100,auVar76);
                  auVar163._4_4_ = fVar193;
                  auVar163._0_4_ = fVar193;
                  auVar163._8_4_ = fVar193;
                  auVar163._12_4_ = fVar193;
                  auVar100 = vfmadd132ps_fma(auVar163,auVar100,auVar23);
                  local_260 = auVar100._0_4_;
                  auVar201._8_4_ = 1;
                  auVar201._0_8_ = 0x100000001;
                  auVar201._12_4_ = 1;
                  auVar201._16_4_ = 1;
                  auVar201._20_4_ = 1;
                  auVar201._24_4_ = 1;
                  auVar201._28_4_ = 1;
                  local_240 = vpermps_avx2(auVar201,ZEXT1632(auVar100));
                  auVar215._8_4_ = 2;
                  auVar215._0_8_ = 0x200000002;
                  auVar215._12_4_ = 2;
                  auVar215._16_4_ = 2;
                  auVar215._20_4_ = 2;
                  auVar215._24_4_ = 2;
                  auVar215._28_4_ = 2;
                  local_220 = vpermps_avx2(auVar215,ZEXT1632(auVar100));
                  iStack_25c = local_260;
                  iStack_258 = local_260;
                  iStack_254 = local_260;
                  iStack_250 = local_260;
                  iStack_24c = local_260;
                  iStack_248 = local_260;
                  iStack_244 = local_260;
                  fStack_1fc = local_200;
                  fStack_1f8 = local_200;
                  fStack_1f4 = local_200;
                  fStack_1f0 = local_200;
                  fStack_1ec = local_200;
                  fStack_1e8 = local_200;
                  fStack_1e4 = local_200;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_360._0_8_;
                  uStack_1b8 = local_360._8_8_;
                  uStack_1b0 = local_360._16_8_;
                  uStack_1a8 = local_360._24_8_;
                  local_1a0 = local_340;
                  auVar119 = vpcmpeqd_avx2(local_340,local_340);
                  local_718[1] = auVar119;
                  *local_718 = auVar119;
                  local_180 = (local_748.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_748.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_640 = local_280._0_8_;
                  uStack_638 = local_280._8_8_;
                  uStack_630 = local_280._16_8_;
                  uStack_628 = local_280._24_8_;
                  local_748.valid = (int *)&local_640;
                  local_748.geometryUserPtr = pGVar11->userPtr;
                  local_748.hit = (RTCHitN *)&local_260;
                  local_748.N = 8;
                  local_4a0 = (uint)uVar86;
                  uStack_49c = (uint)(uVar86 >> 0x20);
                  local_748.ray = (RTCRayN *)ray;
                  if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar11->intersectionFilterN)(&local_748);
                    uVar86 = CONCAT44(uStack_49c,local_4a0);
                    auVar245 = ZEXT1664(local_710);
                    auVar234 = ZEXT3264(local_5c0);
                    auVar244 = ZEXT3264(local_520);
                    auVar243 = ZEXT3264(local_500);
                    auVar242 = ZEXT3264(local_5a0);
                    auVar241 = ZEXT3264(local_580);
                    auVar240 = ZEXT3264(local_4e0);
                    auVar239 = ZEXT3264(local_560);
                    auVar235 = ZEXT3264(local_4c0);
                    auVar236 = ZEXT3264(local_540);
                    auVar100 = vxorps_avx512vl(auVar237,auVar237);
                    auVar238 = ZEXT1664(auVar100);
                    uVar90 = local_5e0._0_4_;
                  }
                  auVar100 = auVar238._0_16_;
                  auVar79._8_8_ = uStack_638;
                  auVar79._0_8_ = local_640;
                  auVar79._16_8_ = uStack_630;
                  auVar79._24_8_ = uStack_628;
                  if (auVar79 == (undefined1  [32])0x0) {
LAB_01c87715:
                    *(float *)(ray + k * 4 + 0x100) = local_320;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_748);
                      uVar86 = CONCAT44(uStack_49c,local_4a0);
                      auVar245 = ZEXT1664(local_710);
                      auVar234 = ZEXT3264(local_5c0);
                      auVar244 = ZEXT3264(local_520);
                      auVar243 = ZEXT3264(local_500);
                      auVar242 = ZEXT3264(local_5a0);
                      auVar241 = ZEXT3264(local_580);
                      auVar240 = ZEXT3264(local_4e0);
                      auVar239 = ZEXT3264(local_560);
                      auVar235 = ZEXT3264(local_4c0);
                      auVar236 = ZEXT3264(local_540);
                      auVar100 = vxorps_avx512vl(auVar100,auVar100);
                      auVar238 = ZEXT1664(auVar100);
                      uVar90 = local_5e0._0_4_;
                    }
                    auVar80._8_8_ = uStack_638;
                    auVar80._0_8_ = local_640;
                    auVar80._16_8_ = uStack_630;
                    auVar80._24_8_ = uStack_628;
                    if (auVar80 == (undefined1  [32])0x0) goto LAB_01c87715;
                    uVar31 = vptestmd_avx512vl(auVar80,auVar80);
                    iVar1 = *(int *)(local_748.hit + 4);
                    iVar2 = *(int *)(local_748.hit + 8);
                    iVar71 = *(int *)(local_748.hit + 0xc);
                    iVar72 = *(int *)(local_748.hit + 0x10);
                    iVar73 = *(int *)(local_748.hit + 0x14);
                    iVar74 = *(int *)(local_748.hit + 0x18);
                    iVar75 = *(int *)(local_748.hit + 0x1c);
                    bVar85 = (byte)uVar31;
                    bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar31 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar31 >> 6) & 1);
                    bVar22 = SUB81(uVar31 >> 7,0);
                    *(uint *)(local_748.ray + 0x180) =
                         (uint)(bVar85 & 1) * *(int *)local_748.hit |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_748.ray + 0x180);
                    *(uint *)(local_748.ray + 0x184) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_748.ray + 0x184);
                    *(uint *)(local_748.ray + 0x188) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_748.ray + 0x188);
                    *(uint *)(local_748.ray + 0x18c) =
                         (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_748.ray + 0x18c);
                    *(uint *)(local_748.ray + 400) =
                         (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_748.ray + 400);
                    *(uint *)(local_748.ray + 0x194) =
                         (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_748.ray + 0x194);
                    *(uint *)(local_748.ray + 0x198) =
                         (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_748.ray + 0x198);
                    *(uint *)(local_748.ray + 0x19c) =
                         (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_748.ray + 0x19c);
                    iVar1 = *(int *)(local_748.hit + 0x24);
                    iVar2 = *(int *)(local_748.hit + 0x28);
                    iVar71 = *(int *)(local_748.hit + 0x2c);
                    iVar72 = *(int *)(local_748.hit + 0x30);
                    iVar73 = *(int *)(local_748.hit + 0x34);
                    iVar74 = *(int *)(local_748.hit + 0x38);
                    iVar75 = *(int *)(local_748.hit + 0x3c);
                    bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar31 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar31 >> 6) & 1);
                    bVar22 = SUB81(uVar31 >> 7,0);
                    *(uint *)(local_748.ray + 0x1a0) =
                         (uint)(bVar85 & 1) * *(int *)(local_748.hit + 0x20) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_748.ray + 0x1a0);
                    *(uint *)(local_748.ray + 0x1a4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_748.ray + 0x1a4);
                    *(uint *)(local_748.ray + 0x1a8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_748.ray + 0x1a8);
                    *(uint *)(local_748.ray + 0x1ac) =
                         (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_748.ray + 0x1ac);
                    *(uint *)(local_748.ray + 0x1b0) =
                         (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_748.ray + 0x1b0);
                    *(uint *)(local_748.ray + 0x1b4) =
                         (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_748.ray + 0x1b4);
                    *(uint *)(local_748.ray + 0x1b8) =
                         (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_748.ray + 0x1b8);
                    *(uint *)(local_748.ray + 0x1bc) =
                         (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_748.ray + 0x1bc);
                    iVar1 = *(int *)(local_748.hit + 0x44);
                    iVar2 = *(int *)(local_748.hit + 0x48);
                    iVar71 = *(int *)(local_748.hit + 0x4c);
                    iVar72 = *(int *)(local_748.hit + 0x50);
                    iVar73 = *(int *)(local_748.hit + 0x54);
                    iVar74 = *(int *)(local_748.hit + 0x58);
                    iVar75 = *(int *)(local_748.hit + 0x5c);
                    bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar31 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar31 >> 6) & 1);
                    bVar22 = SUB81(uVar31 >> 7,0);
                    *(uint *)(local_748.ray + 0x1c0) =
                         (uint)(bVar85 & 1) * *(int *)(local_748.hit + 0x40) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_748.ray + 0x1c0);
                    *(uint *)(local_748.ray + 0x1c4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_748.ray + 0x1c4);
                    *(uint *)(local_748.ray + 0x1c8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_748.ray + 0x1c8);
                    *(uint *)(local_748.ray + 0x1cc) =
                         (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_748.ray + 0x1cc);
                    *(uint *)(local_748.ray + 0x1d0) =
                         (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_748.ray + 0x1d0);
                    *(uint *)(local_748.ray + 0x1d4) =
                         (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_748.ray + 0x1d4);
                    *(uint *)(local_748.ray + 0x1d8) =
                         (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_748.ray + 0x1d8);
                    *(uint *)(local_748.ray + 0x1dc) =
                         (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_748.ray + 0x1dc);
                    iVar1 = *(int *)(local_748.hit + 100);
                    iVar2 = *(int *)(local_748.hit + 0x68);
                    iVar71 = *(int *)(local_748.hit + 0x6c);
                    iVar72 = *(int *)(local_748.hit + 0x70);
                    iVar73 = *(int *)(local_748.hit + 0x74);
                    iVar74 = *(int *)(local_748.hit + 0x78);
                    iVar75 = *(int *)(local_748.hit + 0x7c);
                    bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar31 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar31 >> 6) & 1);
                    bVar22 = SUB81(uVar31 >> 7,0);
                    *(uint *)(local_748.ray + 0x1e0) =
                         (uint)(bVar85 & 1) * *(int *)(local_748.hit + 0x60) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_748.ray + 0x1e0);
                    *(uint *)(local_748.ray + 0x1e4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_748.ray + 0x1e4);
                    *(uint *)(local_748.ray + 0x1e8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_748.ray + 0x1e8);
                    *(uint *)(local_748.ray + 0x1ec) =
                         (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_748.ray + 0x1ec);
                    *(uint *)(local_748.ray + 0x1f0) =
                         (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_748.ray + 0x1f0);
                    *(uint *)(local_748.ray + 500) =
                         (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_748.ray + 500);
                    *(uint *)(local_748.ray + 0x1f8) =
                         (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_748.ray + 0x1f8);
                    *(uint *)(local_748.ray + 0x1fc) =
                         (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_748.ray + 0x1fc);
                    auVar143._0_4_ =
                         (uint)(bVar85 & 1) * *(int *)(local_748.hit + 0x80) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_748.ray + 0x200);
                    bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
                    auVar143._4_4_ =
                         (uint)bVar16 * *(int *)(local_748.hit + 0x84) |
                         (uint)!bVar16 * *(int *)(local_748.ray + 0x204);
                    bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
                    auVar143._8_4_ =
                         (uint)bVar16 * *(int *)(local_748.hit + 0x88) |
                         (uint)!bVar16 * *(int *)(local_748.ray + 0x208);
                    bVar16 = (bool)((byte)(uVar31 >> 3) & 1);
                    auVar143._12_4_ =
                         (uint)bVar16 * *(int *)(local_748.hit + 0x8c) |
                         (uint)!bVar16 * *(int *)(local_748.ray + 0x20c);
                    bVar16 = (bool)((byte)(uVar31 >> 4) & 1);
                    auVar143._16_4_ =
                         (uint)bVar16 * *(int *)(local_748.hit + 0x90) |
                         (uint)!bVar16 * *(int *)(local_748.ray + 0x210);
                    bVar16 = (bool)((byte)(uVar31 >> 5) & 1);
                    auVar143._20_4_ =
                         (uint)bVar16 * *(int *)(local_748.hit + 0x94) |
                         (uint)!bVar16 * *(int *)(local_748.ray + 0x214);
                    bVar16 = (bool)((byte)(uVar31 >> 6) & 1);
                    auVar143._24_4_ =
                         (uint)bVar16 * *(int *)(local_748.hit + 0x98) |
                         (uint)!bVar16 * *(int *)(local_748.ray + 0x218);
                    bVar16 = SUB81(uVar31 >> 7,0);
                    auVar143._28_4_ =
                         (uint)bVar16 * *(int *)(local_748.hit + 0x9c) |
                         (uint)!bVar16 * *(int *)(local_748.ray + 0x21c);
                    *(undefined1 (*) [32])(local_748.ray + 0x200) = auVar143;
                    auVar119 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_748.hit + 0xa0));
                    *(undefined1 (*) [32])(local_748.ray + 0x220) = auVar119;
                    auVar119 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_748.hit + 0xc0));
                    *(undefined1 (*) [32])(local_748.ray + 0x240) = auVar119;
                    auVar119 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_748.hit + 0xe0));
                    *(undefined1 (*) [32])(local_748.ray + 0x260) = auVar119;
                    auVar119 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_748.hit + 0x100));
                    *(undefined1 (*) [32])(local_748.ray + 0x280) = auVar119;
                  }
                  auVar109 = auVar234._0_32_;
                  auVar100 = auVar245._0_16_;
                  bVar85 = ~(byte)(1 << ((uint)uVar86 & 0x1f)) & bVar93;
                  uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar45._4_4_ = uVar154;
                  auVar45._0_4_ = uVar154;
                  auVar45._8_4_ = uVar154;
                  auVar45._12_4_ = uVar154;
                  auVar45._16_4_ = uVar154;
                  auVar45._20_4_ = uVar154;
                  auVar45._24_4_ = uVar154;
                  auVar45._28_4_ = uVar154;
                  uVar155 = vcmpps_avx512vl(local_680,auVar45,2);
                  bVar93 = bVar85 & (byte)uVar155;
                  if ((bVar85 & (byte)uVar155) != 0) {
                    auVar169._8_4_ = 0x7f800000;
                    auVar169._0_8_ = 0x7f8000007f800000;
                    auVar169._12_4_ = 0x7f800000;
                    auVar169._16_4_ = 0x7f800000;
                    auVar169._20_4_ = 0x7f800000;
                    auVar169._24_4_ = 0x7f800000;
                    auVar169._28_4_ = 0x7f800000;
                    auVar119 = vblendmps_avx512vl(auVar169,local_680);
                    auVar144._0_4_ =
                         (uint)(bVar93 & 1) * auVar119._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                    bVar16 = (bool)(bVar93 >> 1 & 1);
                    auVar144._4_4_ = (uint)bVar16 * auVar119._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar93 >> 2 & 1);
                    auVar144._8_4_ = (uint)bVar16 * auVar119._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar93 >> 3 & 1);
                    auVar144._12_4_ = (uint)bVar16 * auVar119._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar93 >> 4 & 1);
                    auVar144._16_4_ = (uint)bVar16 * auVar119._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar93 >> 5 & 1);
                    auVar144._20_4_ = (uint)bVar16 * auVar119._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar93 >> 6 & 1);
                    auVar144._24_4_ = (uint)bVar16 * auVar119._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar144._28_4_ =
                         (uint)(bVar93 >> 7) * auVar119._28_4_ |
                         (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                    auVar119 = vshufps_avx(auVar144,auVar144,0xb1);
                    auVar119 = vminps_avx(auVar144,auVar119);
                    auVar121 = vshufpd_avx(auVar119,auVar119,5);
                    auVar119 = vminps_avx(auVar119,auVar121);
                    auVar121 = vpermpd_avx2(auVar119,0x4e);
                    auVar119 = vminps_avx(auVar119,auVar121);
                    uVar155 = vcmpps_avx512vl(auVar144,auVar119,0);
                    bVar84 = (byte)uVar155 & bVar93;
                    bVar85 = bVar93;
                    if (bVar84 != 0) {
                      bVar85 = bVar84;
                    }
                    uVar88 = 0;
                    for (uVar87 = (uint)bVar85; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000
                        ) {
                      uVar88 = uVar88 + 1;
                    }
                    uVar86 = (ulong)uVar88;
                  }
                } while (bVar93 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar9) {
        auVar119 = vpbroadcastd_avx512vl();
        auVar245 = ZEXT3264(auVar119);
        local_5e0 = vbroadcastss_avx512vl(auVar100);
        local_320 = 1.0 / auVar113._0_4_;
        fStack_31c = local_320;
        fStack_318 = local_320;
        fStack_314 = local_320;
        fStack_310 = local_320;
        fStack_30c = local_320;
        fStack_308 = local_320;
        fStack_304 = local_320;
        local_340 = vpbroadcastd_avx512vl();
        local_360 = vpbroadcastd_avx512vl();
        lVar89 = 8;
        local_5c0 = auVar109;
        local_4a0 = uVar90;
        uStack_49c = uVar90;
        uStack_498 = uVar90;
        uStack_494 = uVar90;
        uStack_490 = uVar90;
        uStack_48c = uVar90;
        uStack_488 = uVar90;
        uStack_484 = uVar90;
        do {
          auVar119 = vpbroadcastd_avx512vl();
          auVar104 = vpor_avx2(auVar119,_DAT_0205a920);
          uVar30 = vpcmpgtd_avx512vl(auVar245._0_32_,auVar104);
          auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 * 4 + lVar32);
          auVar121 = *(undefined1 (*) [32])(lVar32 + 0x2227768 + lVar89 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar32 + 0x2227bec + lVar89 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar32 + 0x2228070 + lVar89 * 4);
          local_500 = auVar243._0_32_;
          auVar105 = vmulps_avx512vl(local_500,auVar116);
          local_520 = auVar244._0_32_;
          auVar115 = vmulps_avx512vl(local_520,auVar116);
          auVar52._4_4_ = auVar116._4_4_ * (float)local_e0._4_4_;
          auVar52._0_4_ = auVar116._0_4_ * (float)local_e0._0_4_;
          auVar52._8_4_ = auVar116._8_4_ * fStack_d8;
          auVar52._12_4_ = auVar116._12_4_ * fStack_d4;
          auVar52._16_4_ = auVar116._16_4_ * fStack_d0;
          auVar52._20_4_ = auVar116._20_4_ * fStack_cc;
          auVar52._24_4_ = auVar116._24_4_ * fStack_c8;
          auVar52._28_4_ = auVar104._28_4_;
          auVar123 = auVar241._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar105,auVar117,auVar123);
          auVar124 = auVar242._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar124);
          auVar115 = vfmadd231ps_avx512vl(auVar52,auVar117,local_c0);
          auVar122 = auVar239._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar121,auVar122);
          local_4e0 = auVar240._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar121,local_4e0);
          auVar100 = vfmadd231ps_fma(auVar115,auVar121,local_a0);
          auVar120 = auVar236._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar104,auVar119,auVar120);
          local_4c0 = auVar235._0_32_;
          auVar110 = vfmadd231ps_avx512vl(auVar105,auVar119,local_4c0);
          auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 * 4 + lVar32);
          auVar105 = *(undefined1 (*) [32])(lVar32 + 0x2229b88 + lVar89 * 4);
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar119,local_80);
          auVar115 = *(undefined1 (*) [32])(lVar32 + 0x222a00c + lVar89 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar32 + 0x222a490 + lVar89 * 4);
          auVar109 = vmulps_avx512vl(local_500,auVar106);
          auVar107 = vmulps_avx512vl(local_520,auVar106);
          auVar53._4_4_ = auVar106._4_4_ * (float)local_e0._4_4_;
          auVar53._0_4_ = auVar106._0_4_ * (float)local_e0._0_4_;
          auVar53._8_4_ = auVar106._8_4_ * fStack_d8;
          auVar53._12_4_ = auVar106._12_4_ * fStack_d4;
          auVar53._16_4_ = auVar106._16_4_ * fStack_d0;
          auVar53._20_4_ = auVar106._20_4_ * fStack_cc;
          auVar53._24_4_ = auVar106._24_4_ * fStack_c8;
          auVar53._28_4_ = uStack_c4;
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar115,auVar123);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,auVar124);
          auVar111 = vfmadd231ps_avx512vl(auVar53,auVar115,local_c0);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar122);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_4e0);
          auVar99 = vfmadd231ps_fma(auVar111,auVar105,local_a0);
          auVar111 = vfmadd231ps_avx512vl(auVar109,auVar104,auVar120);
          auVar112 = vfmadd231ps_avx512vl(auVar107,auVar104,local_4c0);
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar104,local_80);
          auVar113 = vmaxps_avx512vl(ZEXT1632(auVar100),ZEXT1632(auVar99));
          auVar109 = vsubps_avx(auVar111,auVar108);
          auVar107 = vsubps_avx(auVar112,auVar110);
          auVar114 = vmulps_avx512vl(auVar110,auVar109);
          auVar118 = vmulps_avx512vl(auVar108,auVar107);
          auVar114 = vsubps_avx512vl(auVar114,auVar118);
          auVar118 = vmulps_avx512vl(auVar107,auVar107);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar109,auVar109);
          auVar113 = vmulps_avx512vl(auVar113,auVar113);
          auVar113 = vmulps_avx512vl(auVar113,auVar118);
          auVar114 = vmulps_avx512vl(auVar114,auVar114);
          uVar155 = vcmpps_avx512vl(auVar114,auVar113,2);
          local_3d0 = (byte)uVar30 & (byte)uVar155;
          if (local_3d0 == 0) {
            auVar235 = ZEXT3264(local_4c0);
          }
          else {
            auVar106 = vmulps_avx512vl(local_5c0,auVar106);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_140,auVar106);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_120,auVar115);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_100,auVar105);
            auVar116 = vmulps_avx512vl(local_5c0,auVar116);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_140,auVar116);
            auVar121 = vfmadd213ps_avx512vl(auVar121,local_120,auVar117);
            auVar105 = vfmadd213ps_avx512vl(auVar119,local_100,auVar121);
            auVar119 = *(undefined1 (*) [32])(lVar32 + 0x22284f4 + lVar89 * 4);
            auVar121 = *(undefined1 (*) [32])(lVar32 + 0x2228978 + lVar89 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar32 + 0x2228dfc + lVar89 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar32 + 0x2229280 + lVar89 * 4);
            auVar115 = vmulps_avx512vl(local_500,auVar116);
            auVar106 = vmulps_avx512vl(local_520,auVar116);
            auVar116 = vmulps_avx512vl(local_5c0,auVar116);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar123);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar117,auVar124);
            auVar117 = vfmadd231ps_avx512vl(auVar116,local_140,auVar117);
            auVar116 = vfmadd231ps_avx512vl(auVar115,auVar121,auVar122);
            auVar115 = vfmadd231ps_avx512vl(auVar106,auVar121,local_4e0);
            auVar121 = vfmadd231ps_avx512vl(auVar117,local_120,auVar121);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar119,auVar120);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar119,local_4c0);
            auVar106 = vfmadd231ps_avx512vl(auVar121,local_100,auVar119);
            auVar119 = *(undefined1 (*) [32])(lVar32 + 0x222a914 + lVar89 * 4);
            auVar121 = *(undefined1 (*) [32])(lVar32 + 0x222b21c + lVar89 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar32 + 0x222b6a0 + lVar89 * 4);
            auVar113 = vmulps_avx512vl(local_500,auVar117);
            auVar114 = vmulps_avx512vl(local_520,auVar117);
            auVar117 = vmulps_avx512vl(local_5c0,auVar117);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar121,auVar123);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar121,auVar124);
            auVar117 = vfmadd231ps_avx512vl(auVar117,local_140,auVar121);
            auVar121 = *(undefined1 (*) [32])(lVar32 + 0x222ad98 + lVar89 * 4);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar121,auVar122);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar121,local_4e0);
            auVar121 = vfmadd231ps_avx512vl(auVar117,local_120,auVar121);
            auVar117 = vfmadd231ps_avx512vl(auVar113,auVar119,auVar120);
            auVar113 = vfmadd231ps_avx512vl(auVar114,auVar119,local_4c0);
            auVar121 = vfmadd231ps_avx512vl(auVar121,local_100,auVar119);
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar116,auVar114);
            vandps_avx512vl(auVar115,auVar114);
            auVar119 = vmaxps_avx(auVar114,auVar114);
            vandps_avx512vl(auVar106,auVar114);
            auVar119 = vmaxps_avx(auVar119,auVar114);
            uVar86 = vcmpps_avx512vl(auVar119,local_5e0,1);
            bVar16 = (bool)((byte)uVar86 & 1);
            auVar131._0_4_ = (float)((uint)bVar16 * auVar109._0_4_ | (uint)!bVar16 * auVar116._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar116._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar116._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar116._12_4_);
            bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar131._16_4_ =
                 (float)((uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * auVar116._16_4_);
            bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar131._20_4_ =
                 (float)((uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * auVar116._20_4_);
            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar131._24_4_ =
                 (float)((uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * auVar116._24_4_);
            bVar16 = SUB81(uVar86 >> 7,0);
            auVar131._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar116._28_4_;
            bVar16 = (bool)((byte)uVar86 & 1);
            auVar132._0_4_ = (float)((uint)bVar16 * auVar107._0_4_ | (uint)!bVar16 * auVar115._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar16 * auVar107._4_4_ | (uint)!bVar16 * auVar115._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar16 * auVar107._8_4_ | (uint)!bVar16 * auVar115._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar16 * auVar107._12_4_ | (uint)!bVar16 * auVar115._12_4_);
            bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar132._16_4_ =
                 (float)((uint)bVar16 * auVar107._16_4_ | (uint)!bVar16 * auVar115._16_4_);
            bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar132._20_4_ =
                 (float)((uint)bVar16 * auVar107._20_4_ | (uint)!bVar16 * auVar115._20_4_);
            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar132._24_4_ =
                 (float)((uint)bVar16 * auVar107._24_4_ | (uint)!bVar16 * auVar115._24_4_);
            bVar16 = SUB81(uVar86 >> 7,0);
            auVar132._28_4_ = (uint)bVar16 * auVar107._28_4_ | (uint)!bVar16 * auVar115._28_4_;
            vandps_avx512vl(auVar117,auVar114);
            vandps_avx512vl(auVar113,auVar114);
            auVar119 = vmaxps_avx(auVar132,auVar132);
            vandps_avx512vl(auVar121,auVar114);
            auVar119 = vmaxps_avx(auVar119,auVar132);
            uVar86 = vcmpps_avx512vl(auVar119,local_5e0,1);
            bVar16 = (bool)((byte)uVar86 & 1);
            auVar133._0_4_ = (uint)bVar16 * auVar109._0_4_ | (uint)!bVar16 * auVar117._0_4_;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar133._4_4_ = (uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar117._4_4_;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar133._8_4_ = (uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar117._8_4_;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar133._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar117._12_4_;
            bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar133._16_4_ = (uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * auVar117._16_4_;
            bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar133._20_4_ = (uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * auVar117._20_4_;
            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar133._24_4_ = (uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * auVar117._24_4_;
            bVar16 = SUB81(uVar86 >> 7,0);
            auVar133._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar117._28_4_;
            bVar16 = (bool)((byte)uVar86 & 1);
            auVar134._0_4_ = (float)((uint)bVar16 * auVar107._0_4_ | (uint)!bVar16 * auVar113._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar16 * auVar107._4_4_ | (uint)!bVar16 * auVar113._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar16 * auVar107._8_4_ | (uint)!bVar16 * auVar113._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar16 * auVar107._12_4_ | (uint)!bVar16 * auVar113._12_4_);
            bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar134._16_4_ =
                 (float)((uint)bVar16 * auVar107._16_4_ | (uint)!bVar16 * auVar113._16_4_);
            bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar134._20_4_ =
                 (float)((uint)bVar16 * auVar107._20_4_ | (uint)!bVar16 * auVar113._20_4_);
            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar134._24_4_ =
                 (float)((uint)bVar16 * auVar107._24_4_ | (uint)!bVar16 * auVar113._24_4_);
            bVar16 = SUB81(uVar86 >> 7,0);
            auVar134._28_4_ = (uint)bVar16 * auVar107._28_4_ | (uint)!bVar16 * auVar113._28_4_;
            auVar224._8_4_ = 0x80000000;
            auVar224._0_8_ = 0x8000000080000000;
            auVar224._12_4_ = 0x80000000;
            auVar224._16_4_ = 0x80000000;
            auVar224._20_4_ = 0x80000000;
            auVar224._24_4_ = 0x80000000;
            auVar224._28_4_ = 0x80000000;
            auVar119 = vxorps_avx512vl(auVar133,auVar224);
            auVar113 = auVar238._0_32_;
            auVar121 = vfmadd213ps_avx512vl(auVar131,auVar131,auVar113);
            auVar237 = vfmadd231ps_fma(auVar121,auVar132,auVar132);
            auVar121 = vrsqrt14ps_avx512vl(ZEXT1632(auVar237));
            auVar233._8_4_ = 0xbf000000;
            auVar233._0_8_ = 0xbf000000bf000000;
            auVar233._12_4_ = 0xbf000000;
            auVar233._16_4_ = 0xbf000000;
            auVar233._20_4_ = 0xbf000000;
            auVar233._24_4_ = 0xbf000000;
            auVar233._28_4_ = 0xbf000000;
            fVar193 = auVar121._0_4_;
            fVar202 = auVar121._4_4_;
            fVar203 = auVar121._8_4_;
            fVar204 = auVar121._12_4_;
            fVar184 = auVar121._16_4_;
            fVar192 = auVar121._20_4_;
            fVar94 = auVar121._24_4_;
            auVar54._4_4_ = fVar202 * fVar202 * fVar202 * auVar237._4_4_ * -0.5;
            auVar54._0_4_ = fVar193 * fVar193 * fVar193 * auVar237._0_4_ * -0.5;
            auVar54._8_4_ = fVar203 * fVar203 * fVar203 * auVar237._8_4_ * -0.5;
            auVar54._12_4_ = fVar204 * fVar204 * fVar204 * auVar237._12_4_ * -0.5;
            auVar54._16_4_ = fVar184 * fVar184 * fVar184 * -0.0;
            auVar54._20_4_ = fVar192 * fVar192 * fVar192 * -0.0;
            auVar54._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
            auVar54._28_4_ = auVar132._28_4_;
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar121 = vfmadd231ps_avx512vl(auVar54,auVar117,auVar121);
            auVar55._4_4_ = auVar132._4_4_ * auVar121._4_4_;
            auVar55._0_4_ = auVar132._0_4_ * auVar121._0_4_;
            auVar55._8_4_ = auVar132._8_4_ * auVar121._8_4_;
            auVar55._12_4_ = auVar132._12_4_ * auVar121._12_4_;
            auVar55._16_4_ = auVar132._16_4_ * auVar121._16_4_;
            auVar55._20_4_ = auVar132._20_4_ * auVar121._20_4_;
            auVar55._24_4_ = auVar132._24_4_ * auVar121._24_4_;
            auVar55._28_4_ = 0;
            auVar56._4_4_ = auVar121._4_4_ * -auVar131._4_4_;
            auVar56._0_4_ = auVar121._0_4_ * -auVar131._0_4_;
            auVar56._8_4_ = auVar121._8_4_ * -auVar131._8_4_;
            auVar56._12_4_ = auVar121._12_4_ * -auVar131._12_4_;
            auVar56._16_4_ = auVar121._16_4_ * -auVar131._16_4_;
            auVar56._20_4_ = auVar121._20_4_ * -auVar131._20_4_;
            auVar56._24_4_ = auVar121._24_4_ * -auVar131._24_4_;
            auVar56._28_4_ = auVar132._28_4_;
            auVar116 = vmulps_avx512vl(auVar121,auVar113);
            auVar121 = vfmadd213ps_avx512vl(auVar133,auVar133,auVar113);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar134,auVar134);
            auVar115 = vrsqrt14ps_avx512vl(auVar121);
            auVar121 = vmulps_avx512vl(auVar121,auVar233);
            fVar193 = auVar115._0_4_;
            fVar202 = auVar115._4_4_;
            fVar203 = auVar115._8_4_;
            fVar204 = auVar115._12_4_;
            fVar184 = auVar115._16_4_;
            fVar192 = auVar115._20_4_;
            fVar94 = auVar115._24_4_;
            auVar57._4_4_ = fVar202 * fVar202 * fVar202 * auVar121._4_4_;
            auVar57._0_4_ = fVar193 * fVar193 * fVar193 * auVar121._0_4_;
            auVar57._8_4_ = fVar203 * fVar203 * fVar203 * auVar121._8_4_;
            auVar57._12_4_ = fVar204 * fVar204 * fVar204 * auVar121._12_4_;
            auVar57._16_4_ = fVar184 * fVar184 * fVar184 * auVar121._16_4_;
            auVar57._20_4_ = fVar192 * fVar192 * fVar192 * auVar121._20_4_;
            auVar57._24_4_ = fVar94 * fVar94 * fVar94 * auVar121._24_4_;
            auVar57._28_4_ = auVar121._28_4_;
            auVar121 = vfmadd231ps_avx512vl(auVar57,auVar117,auVar115);
            auVar58._4_4_ = auVar134._4_4_ * auVar121._4_4_;
            auVar58._0_4_ = auVar134._0_4_ * auVar121._0_4_;
            auVar58._8_4_ = auVar134._8_4_ * auVar121._8_4_;
            auVar58._12_4_ = auVar134._12_4_ * auVar121._12_4_;
            auVar58._16_4_ = auVar134._16_4_ * auVar121._16_4_;
            auVar58._20_4_ = auVar134._20_4_ * auVar121._20_4_;
            auVar58._24_4_ = auVar134._24_4_ * auVar121._24_4_;
            auVar58._28_4_ = auVar115._28_4_;
            auVar59._4_4_ = auVar121._4_4_ * auVar119._4_4_;
            auVar59._0_4_ = auVar121._0_4_ * auVar119._0_4_;
            auVar59._8_4_ = auVar121._8_4_ * auVar119._8_4_;
            auVar59._12_4_ = auVar121._12_4_ * auVar119._12_4_;
            auVar59._16_4_ = auVar121._16_4_ * auVar119._16_4_;
            auVar59._20_4_ = auVar121._20_4_ * auVar119._20_4_;
            auVar59._24_4_ = auVar121._24_4_ * auVar119._24_4_;
            auVar59._28_4_ = auVar119._28_4_;
            auVar119 = vmulps_avx512vl(auVar121,auVar113);
            auVar237 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar100),auVar108);
            auVar121 = ZEXT1632(auVar100);
            auVar24 = vfmadd213ps_fma(auVar56,auVar121,auVar110);
            auVar117 = vfmadd213ps_avx512vl(auVar116,auVar121,auVar105);
            auVar115 = vfmadd213ps_avx512vl(auVar58,ZEXT1632(auVar99),auVar111);
            auVar29 = vfnmadd213ps_fma(auVar55,auVar121,auVar108);
            auVar106 = ZEXT1632(auVar99);
            auVar25 = vfmadd213ps_fma(auVar59,auVar106,auVar112);
            auVar101 = vfnmadd213ps_fma(auVar56,auVar121,auVar110);
            auVar26 = vfmadd213ps_fma(auVar119,auVar106,auVar104);
            auVar110 = ZEXT1632(auVar100);
            auVar34 = vfnmadd231ps_fma(auVar105,auVar110,auVar116);
            auVar102 = vfnmadd213ps_fma(auVar58,auVar106,auVar111);
            auVar33 = vfnmadd213ps_fma(auVar59,auVar106,auVar112);
            auVar103 = vfnmadd231ps_fma(auVar104,ZEXT1632(auVar99),auVar119);
            auVar104 = vsubps_avx512vl(auVar115,ZEXT1632(auVar29));
            auVar119 = vsubps_avx(ZEXT1632(auVar25),ZEXT1632(auVar101));
            auVar121 = vsubps_avx(ZEXT1632(auVar26),ZEXT1632(auVar34));
            auVar60._4_4_ = auVar119._4_4_ * auVar34._4_4_;
            auVar60._0_4_ = auVar119._0_4_ * auVar34._0_4_;
            auVar60._8_4_ = auVar119._8_4_ * auVar34._8_4_;
            auVar60._12_4_ = auVar119._12_4_ * auVar34._12_4_;
            auVar60._16_4_ = auVar119._16_4_ * 0.0;
            auVar60._20_4_ = auVar119._20_4_ * 0.0;
            auVar60._24_4_ = auVar119._24_4_ * 0.0;
            auVar60._28_4_ = auVar116._28_4_;
            auVar100 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar101),auVar121);
            auVar61._4_4_ = auVar121._4_4_ * auVar29._4_4_;
            auVar61._0_4_ = auVar121._0_4_ * auVar29._0_4_;
            auVar61._8_4_ = auVar121._8_4_ * auVar29._8_4_;
            auVar61._12_4_ = auVar121._12_4_ * auVar29._12_4_;
            auVar61._16_4_ = auVar121._16_4_ * 0.0;
            auVar61._20_4_ = auVar121._20_4_ * 0.0;
            auVar61._24_4_ = auVar121._24_4_ * 0.0;
            auVar61._28_4_ = auVar121._28_4_;
            auVar27 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar34),auVar104);
            auVar62._4_4_ = auVar101._4_4_ * auVar104._4_4_;
            auVar62._0_4_ = auVar101._0_4_ * auVar104._0_4_;
            auVar62._8_4_ = auVar101._8_4_ * auVar104._8_4_;
            auVar62._12_4_ = auVar101._12_4_ * auVar104._12_4_;
            auVar62._16_4_ = auVar104._16_4_ * 0.0;
            auVar62._20_4_ = auVar104._20_4_ * 0.0;
            auVar62._24_4_ = auVar104._24_4_ * 0.0;
            auVar62._28_4_ = auVar104._28_4_;
            auVar28 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar29),auVar119);
            auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar28),auVar113,ZEXT1632(auVar27));
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar113,ZEXT1632(auVar100));
            uVar86 = vcmpps_avx512vl(auVar119,auVar113,2);
            bVar93 = (byte)uVar86;
            fVar146 = (float)((uint)(bVar93 & 1) * auVar237._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * auVar102._0_4_);
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            fVar148 = (float)((uint)bVar16 * auVar237._4_4_ | (uint)!bVar16 * auVar102._4_4_);
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            fVar151 = (float)((uint)bVar16 * auVar237._8_4_ | (uint)!bVar16 * auVar102._8_4_);
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            fVar152 = (float)((uint)bVar16 * auVar237._12_4_ | (uint)!bVar16 * auVar102._12_4_);
            auVar106 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar151,CONCAT44(fVar148,fVar146))));
            fVar147 = (float)((uint)(bVar93 & 1) * auVar24._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * auVar33._0_4_);
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            fVar150 = (float)((uint)bVar16 * auVar24._4_4_ | (uint)!bVar16 * auVar33._4_4_);
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            fVar149 = (float)((uint)bVar16 * auVar24._8_4_ | (uint)!bVar16 * auVar33._8_4_);
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            fVar153 = (float)((uint)bVar16 * auVar24._12_4_ | (uint)!bVar16 * auVar33._12_4_);
            auVar109 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar149,CONCAT44(fVar150,fVar147))));
            auVar135._0_4_ =
                 (float)((uint)(bVar93 & 1) * auVar117._0_4_ |
                        (uint)!(bool)(bVar93 & 1) * auVar103._0_4_);
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * auVar103._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * auVar103._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * auVar103._12_4_);
            fVar203 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar117._16_4_);
            auVar135._16_4_ = fVar203;
            fVar193 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar117._20_4_);
            auVar135._20_4_ = fVar193;
            fVar202 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar117._24_4_);
            auVar135._24_4_ = fVar202;
            iVar1 = (uint)(byte)(uVar86 >> 7) * auVar117._28_4_;
            auVar135._28_4_ = iVar1;
            auVar119 = vblendmps_avx512vl(ZEXT1632(auVar29),auVar115);
            auVar136._0_4_ =
                 (uint)(bVar93 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar100._0_4_;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar136._4_4_ = (uint)bVar16 * auVar119._4_4_ | (uint)!bVar16 * auVar100._4_4_;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar136._8_4_ = (uint)bVar16 * auVar119._8_4_ | (uint)!bVar16 * auVar100._8_4_;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar136._12_4_ = (uint)bVar16 * auVar119._12_4_ | (uint)!bVar16 * auVar100._12_4_;
            auVar136._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar119._16_4_;
            auVar136._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar119._20_4_;
            auVar136._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar119._24_4_;
            auVar136._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar119._28_4_;
            auVar119 = vblendmps_avx512vl(ZEXT1632(auVar101),ZEXT1632(auVar25));
            auVar137._0_4_ =
                 (float)((uint)(bVar93 & 1) * auVar119._0_4_ |
                        (uint)!(bool)(bVar93 & 1) * auVar237._0_4_);
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar137._4_4_ = (float)((uint)bVar16 * auVar119._4_4_ | (uint)!bVar16 * auVar237._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar137._8_4_ = (float)((uint)bVar16 * auVar119._8_4_ | (uint)!bVar16 * auVar237._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar137._12_4_ =
                 (float)((uint)bVar16 * auVar119._12_4_ | (uint)!bVar16 * auVar237._12_4_);
            fVar184 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar119._16_4_);
            auVar137._16_4_ = fVar184;
            fVar192 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar119._20_4_);
            auVar137._20_4_ = fVar192;
            fVar204 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar119._24_4_);
            auVar137._24_4_ = fVar204;
            auVar137._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar119._28_4_;
            auVar119 = vblendmps_avx512vl(ZEXT1632(auVar34),ZEXT1632(auVar26));
            auVar138._0_4_ =
                 (float)((uint)(bVar93 & 1) * auVar119._0_4_ |
                        (uint)!(bool)(bVar93 & 1) * auVar24._0_4_);
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar16 * auVar119._4_4_ | (uint)!bVar16 * auVar24._4_4_);
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar16 * auVar119._8_4_ | (uint)!bVar16 * auVar24._8_4_);
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar16 * auVar119._12_4_ | (uint)!bVar16 * auVar24._12_4_);
            fVar145 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar119._16_4_);
            auVar138._16_4_ = fVar145;
            fVar95 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar119._20_4_);
            auVar138._20_4_ = fVar95;
            fVar94 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar119._24_4_);
            auVar138._24_4_ = fVar94;
            iVar2 = (uint)(byte)(uVar86 >> 7) * auVar119._28_4_;
            auVar138._28_4_ = iVar2;
            auVar139._0_4_ =
                 (uint)(bVar93 & 1) * (int)auVar29._0_4_ |
                 (uint)!(bool)(bVar93 & 1) * auVar115._0_4_;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar139._4_4_ = (uint)bVar16 * (int)auVar29._4_4_ | (uint)!bVar16 * auVar115._4_4_;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar139._8_4_ = (uint)bVar16 * (int)auVar29._8_4_ | (uint)!bVar16 * auVar115._8_4_;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar139._12_4_ = (uint)bVar16 * (int)auVar29._12_4_ | (uint)!bVar16 * auVar115._12_4_;
            auVar139._16_4_ = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * auVar115._16_4_;
            auVar139._20_4_ = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * auVar115._20_4_;
            auVar139._24_4_ = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * auVar115._24_4_;
            auVar139._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar115._28_4_;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar86 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar115 = vsubps_avx512vl(auVar139,auVar106);
            auVar121 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar101._12_4_ |
                                                     (uint)!bVar20 * auVar25._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar101._8_4_ |
                                                              (uint)!bVar18 * auVar25._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar101._4_4_ |
                                                                       (uint)!bVar16 * auVar25._4_4_
                                                                       ,(uint)(bVar93 & 1) *
                                                                        (int)auVar101._0_4_ |
                                                                        (uint)!(bool)(bVar93 & 1) *
                                                                        auVar25._0_4_)))),auVar109);
            auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar34._12_4_ |
                                                     (uint)!bVar21 * auVar26._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar34._8_4_ |
                                                              (uint)!bVar19 * auVar26._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar34._4_4_ |
                                                                       (uint)!bVar17 * auVar26._4_4_
                                                                       ,(uint)(bVar93 & 1) *
                                                                        (int)auVar34._0_4_ |
                                                                        (uint)!(bool)(bVar93 & 1) *
                                                                        auVar26._0_4_)))),auVar135);
            auVar116 = vsubps_avx(auVar106,auVar136);
            auVar104 = vsubps_avx(auVar109,auVar137);
            auVar105 = vsubps_avx(auVar135,auVar138);
            auVar63._4_4_ = auVar117._4_4_ * fVar148;
            auVar63._0_4_ = auVar117._0_4_ * fVar146;
            auVar63._8_4_ = auVar117._8_4_ * fVar151;
            auVar63._12_4_ = auVar117._12_4_ * fVar152;
            auVar63._16_4_ = auVar117._16_4_ * 0.0;
            auVar63._20_4_ = auVar117._20_4_ * 0.0;
            auVar63._24_4_ = auVar117._24_4_ * 0.0;
            auVar63._28_4_ = 0;
            auVar100 = vfmsub231ps_fma(auVar63,auVar135,auVar115);
            auVar191._0_4_ = fVar147 * auVar115._0_4_;
            auVar191._4_4_ = fVar150 * auVar115._4_4_;
            auVar191._8_4_ = fVar149 * auVar115._8_4_;
            auVar191._12_4_ = fVar153 * auVar115._12_4_;
            auVar191._16_4_ = auVar115._16_4_ * 0.0;
            auVar191._20_4_ = auVar115._20_4_ * 0.0;
            auVar191._24_4_ = auVar115._24_4_ * 0.0;
            auVar191._28_4_ = 0;
            auVar237 = vfmsub231ps_fma(auVar191,auVar106,auVar121);
            auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar237),auVar113,ZEXT1632(auVar100));
            auVar198._0_4_ = auVar121._0_4_ * auVar135._0_4_;
            auVar198._4_4_ = auVar121._4_4_ * auVar135._4_4_;
            auVar198._8_4_ = auVar121._8_4_ * auVar135._8_4_;
            auVar198._12_4_ = auVar121._12_4_ * auVar135._12_4_;
            auVar198._16_4_ = auVar121._16_4_ * fVar203;
            auVar198._20_4_ = auVar121._20_4_ * fVar193;
            auVar198._24_4_ = auVar121._24_4_ * fVar202;
            auVar198._28_4_ = 0;
            auVar100 = vfmsub231ps_fma(auVar198,auVar109,auVar117);
            auVar107 = vfmadd231ps_avx512vl(auVar119,auVar113,ZEXT1632(auVar100));
            auVar119 = vmulps_avx512vl(auVar105,auVar136);
            auVar119 = vfmsub231ps_avx512vl(auVar119,auVar116,auVar138);
            auVar64._4_4_ = auVar104._4_4_ * auVar138._4_4_;
            auVar64._0_4_ = auVar104._0_4_ * auVar138._0_4_;
            auVar64._8_4_ = auVar104._8_4_ * auVar138._8_4_;
            auVar64._12_4_ = auVar104._12_4_ * auVar138._12_4_;
            auVar64._16_4_ = auVar104._16_4_ * fVar145;
            auVar64._20_4_ = auVar104._20_4_ * fVar95;
            auVar64._24_4_ = auVar104._24_4_ * fVar94;
            auVar64._28_4_ = iVar2;
            auVar100 = vfmsub231ps_fma(auVar64,auVar137,auVar105);
            auVar199._0_4_ = auVar137._0_4_ * auVar116._0_4_;
            auVar199._4_4_ = auVar137._4_4_ * auVar116._4_4_;
            auVar199._8_4_ = auVar137._8_4_ * auVar116._8_4_;
            auVar199._12_4_ = auVar137._12_4_ * auVar116._12_4_;
            auVar199._16_4_ = fVar184 * auVar116._16_4_;
            auVar199._20_4_ = fVar192 * auVar116._20_4_;
            auVar199._24_4_ = fVar204 * auVar116._24_4_;
            auVar199._28_4_ = 0;
            auVar237 = vfmsub231ps_fma(auVar199,auVar104,auVar136);
            auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar237),auVar113,auVar119);
            auVar108 = vfmadd231ps_avx512vl(auVar119,auVar113,ZEXT1632(auVar100));
            auVar119 = vmaxps_avx(auVar107,auVar108);
            uVar155 = vcmpps_avx512vl(auVar119,auVar113,2);
            local_3d0 = local_3d0 & (byte)uVar155;
            if (local_3d0 == 0) {
LAB_01c86d4e:
              local_3d0 = 0;
            }
            else {
              auVar65._4_4_ = auVar105._4_4_ * auVar121._4_4_;
              auVar65._0_4_ = auVar105._0_4_ * auVar121._0_4_;
              auVar65._8_4_ = auVar105._8_4_ * auVar121._8_4_;
              auVar65._12_4_ = auVar105._12_4_ * auVar121._12_4_;
              auVar65._16_4_ = auVar105._16_4_ * auVar121._16_4_;
              auVar65._20_4_ = auVar105._20_4_ * auVar121._20_4_;
              auVar65._24_4_ = auVar105._24_4_ * auVar121._24_4_;
              auVar65._28_4_ = auVar119._28_4_;
              auVar24 = vfmsub231ps_fma(auVar65,auVar104,auVar117);
              auVar66._4_4_ = auVar117._4_4_ * auVar116._4_4_;
              auVar66._0_4_ = auVar117._0_4_ * auVar116._0_4_;
              auVar66._8_4_ = auVar117._8_4_ * auVar116._8_4_;
              auVar66._12_4_ = auVar117._12_4_ * auVar116._12_4_;
              auVar66._16_4_ = auVar117._16_4_ * auVar116._16_4_;
              auVar66._20_4_ = auVar117._20_4_ * auVar116._20_4_;
              auVar66._24_4_ = auVar117._24_4_ * auVar116._24_4_;
              auVar66._28_4_ = auVar117._28_4_;
              auVar237 = vfmsub231ps_fma(auVar66,auVar115,auVar105);
              auVar67._4_4_ = auVar104._4_4_ * auVar115._4_4_;
              auVar67._0_4_ = auVar104._0_4_ * auVar115._0_4_;
              auVar67._8_4_ = auVar104._8_4_ * auVar115._8_4_;
              auVar67._12_4_ = auVar104._12_4_ * auVar115._12_4_;
              auVar67._16_4_ = auVar104._16_4_ * auVar115._16_4_;
              auVar67._20_4_ = auVar104._20_4_ * auVar115._20_4_;
              auVar67._24_4_ = auVar104._24_4_ * auVar115._24_4_;
              auVar67._28_4_ = auVar104._28_4_;
              auVar25 = vfmsub231ps_fma(auVar67,auVar116,auVar121);
              auVar100 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar237),ZEXT1632(auVar25));
              auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),ZEXT1632(auVar24),auVar113);
              auVar121 = vrcp14ps_avx512vl(auVar119);
              auVar40._8_4_ = 0x3f800000;
              auVar40._0_8_ = &DAT_3f8000003f800000;
              auVar40._12_4_ = 0x3f800000;
              auVar40._16_4_ = 0x3f800000;
              auVar40._20_4_ = 0x3f800000;
              auVar40._24_4_ = 0x3f800000;
              auVar40._28_4_ = 0x3f800000;
              auVar117 = vfnmadd213ps_avx512vl(auVar121,auVar119,auVar40);
              auVar100 = vfmadd132ps_fma(auVar117,auVar121,auVar121);
              auVar68._4_4_ = auVar25._4_4_ * auVar135._4_4_;
              auVar68._0_4_ = auVar25._0_4_ * auVar135._0_4_;
              auVar68._8_4_ = auVar25._8_4_ * auVar135._8_4_;
              auVar68._12_4_ = auVar25._12_4_ * auVar135._12_4_;
              auVar68._16_4_ = fVar203 * 0.0;
              auVar68._20_4_ = fVar193 * 0.0;
              auVar68._24_4_ = fVar202 * 0.0;
              auVar68._28_4_ = iVar1;
              auVar237 = vfmadd231ps_fma(auVar68,auVar109,ZEXT1632(auVar237));
              auVar237 = vfmadd231ps_fma(ZEXT1632(auVar237),auVar106,ZEXT1632(auVar24));
              fVar193 = auVar100._0_4_;
              fVar202 = auVar100._4_4_;
              fVar203 = auVar100._8_4_;
              fVar204 = auVar100._12_4_;
              auVar121 = ZEXT1632(CONCAT412(auVar237._12_4_ * fVar204,
                                            CONCAT48(auVar237._8_4_ * fVar203,
                                                     CONCAT44(auVar237._4_4_ * fVar202,
                                                              auVar237._0_4_ * fVar193))));
              auVar83._4_4_ = uStack_49c;
              auVar83._0_4_ = local_4a0;
              auVar83._8_4_ = uStack_498;
              auVar83._12_4_ = uStack_494;
              auVar83._16_4_ = uStack_490;
              auVar83._20_4_ = uStack_48c;
              auVar83._24_4_ = uStack_488;
              auVar83._28_4_ = uStack_484;
              uVar155 = vcmpps_avx512vl(auVar121,auVar83,0xd);
              uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar41._4_4_ = uVar154;
              auVar41._0_4_ = uVar154;
              auVar41._8_4_ = uVar154;
              auVar41._12_4_ = uVar154;
              auVar41._16_4_ = uVar154;
              auVar41._20_4_ = uVar154;
              auVar41._24_4_ = uVar154;
              auVar41._28_4_ = uVar154;
              uVar30 = vcmpps_avx512vl(auVar121,auVar41,2);
              local_3d0 = (byte)uVar155 & (byte)uVar30 & local_3d0;
              if (local_3d0 == 0) goto LAB_01c86d4e;
              uVar155 = vcmpps_avx512vl(auVar119,auVar113,4);
              if ((local_3d0 & (byte)uVar155) == 0) {
                local_3d0 = 0;
              }
              else {
                local_3d0 = local_3d0 & (byte)uVar155;
                fVar184 = auVar107._0_4_ * fVar193;
                fVar192 = auVar107._4_4_ * fVar202;
                auVar69._4_4_ = fVar192;
                auVar69._0_4_ = fVar184;
                fVar94 = auVar107._8_4_ * fVar203;
                auVar69._8_4_ = fVar94;
                fVar95 = auVar107._12_4_ * fVar204;
                auVar69._12_4_ = fVar95;
                fVar145 = auVar107._16_4_ * 0.0;
                auVar69._16_4_ = fVar145;
                fVar146 = auVar107._20_4_ * 0.0;
                auVar69._20_4_ = fVar146;
                fVar147 = auVar107._24_4_ * 0.0;
                auVar69._24_4_ = fVar147;
                auVar69._28_4_ = auVar107._28_4_;
                fVar193 = auVar108._0_4_ * fVar193;
                fVar202 = auVar108._4_4_ * fVar202;
                auVar70._4_4_ = fVar202;
                auVar70._0_4_ = fVar193;
                fVar203 = auVar108._8_4_ * fVar203;
                auVar70._8_4_ = fVar203;
                fVar204 = auVar108._12_4_ * fVar204;
                auVar70._12_4_ = fVar204;
                fVar148 = auVar108._16_4_ * 0.0;
                auVar70._16_4_ = fVar148;
                fVar150 = auVar108._20_4_ * 0.0;
                auVar70._20_4_ = fVar150;
                fVar151 = auVar108._24_4_ * 0.0;
                auVar70._24_4_ = fVar151;
                auVar70._28_4_ = auVar108._28_4_;
                auVar213._8_4_ = 0x3f800000;
                auVar213._0_8_ = &DAT_3f8000003f800000;
                auVar213._12_4_ = 0x3f800000;
                auVar213._16_4_ = 0x3f800000;
                auVar213._20_4_ = 0x3f800000;
                auVar213._24_4_ = 0x3f800000;
                auVar213._28_4_ = 0x3f800000;
                auVar119 = vsubps_avx(auVar213,auVar69);
                local_6a0._0_4_ =
                     (uint)(bVar93 & 1) * (int)fVar184 | (uint)!(bool)(bVar93 & 1) * auVar119._0_4_;
                bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
                local_6a0._4_4_ = (uint)bVar16 * (int)fVar192 | (uint)!bVar16 * auVar119._4_4_;
                bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
                local_6a0._8_4_ = (uint)bVar16 * (int)fVar94 | (uint)!bVar16 * auVar119._8_4_;
                bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
                local_6a0._12_4_ = (uint)bVar16 * (int)fVar95 | (uint)!bVar16 * auVar119._12_4_;
                bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
                local_6a0._16_4_ = (uint)bVar16 * (int)fVar145 | (uint)!bVar16 * auVar119._16_4_;
                bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
                local_6a0._20_4_ = (uint)bVar16 * (int)fVar146 | (uint)!bVar16 * auVar119._20_4_;
                bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
                local_6a0._24_4_ = (uint)bVar16 * (int)fVar147 | (uint)!bVar16 * auVar119._24_4_;
                bVar16 = SUB81(uVar86 >> 7,0);
                local_6a0._28_4_ = (uint)bVar16 * auVar107._28_4_ | (uint)!bVar16 * auVar119._28_4_;
                auVar119 = vsubps_avx(auVar213,auVar70);
                bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar86 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar86 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar86 >> 6) & 1);
                bVar22 = SUB81(uVar86 >> 7,0);
                local_300._4_4_ = (uint)bVar16 * (int)fVar202 | (uint)!bVar16 * auVar119._4_4_;
                local_300._0_4_ =
                     (uint)(bVar93 & 1) * (int)fVar193 | (uint)!(bool)(bVar93 & 1) * auVar119._0_4_;
                local_300._8_4_ = (uint)bVar17 * (int)fVar203 | (uint)!bVar17 * auVar119._8_4_;
                local_300._12_4_ = (uint)bVar18 * (int)fVar204 | (uint)!bVar18 * auVar119._12_4_;
                local_300._16_4_ = (uint)bVar19 * (int)fVar148 | (uint)!bVar19 * auVar119._16_4_;
                local_300._20_4_ = (uint)bVar20 * (int)fVar150 | (uint)!bVar20 * auVar119._20_4_;
                local_300._24_4_ = (uint)bVar21 * (int)fVar151 | (uint)!bVar21 * auVar119._24_4_;
                local_300._28_4_ = (uint)bVar22 * auVar108._28_4_ | (uint)!bVar22 * auVar119._28_4_;
                local_6c0 = auVar121;
              }
            }
            auVar235 = ZEXT3264(local_4c0);
            if (local_3d0 != 0) {
              auVar119 = vsubps_avx(ZEXT1632(auVar99),auVar110);
              auVar100 = vfmadd213ps_fma(auVar119,local_6a0,auVar110);
              uVar154 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar42._4_4_ = uVar154;
              auVar42._0_4_ = uVar154;
              auVar42._8_4_ = uVar154;
              auVar42._12_4_ = uVar154;
              auVar42._16_4_ = uVar154;
              auVar42._20_4_ = uVar154;
              auVar42._24_4_ = uVar154;
              auVar42._28_4_ = uVar154;
              auVar119 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar100._12_4_ + auVar100._12_4_,
                                                            CONCAT48(auVar100._8_4_ + auVar100._8_4_
                                                                     ,CONCAT44(auVar100._4_4_ +
                                                                               auVar100._4_4_,
                                                                               auVar100._0_4_ +
                                                                               auVar100._0_4_)))),
                                         auVar42);
              uVar155 = vcmpps_avx512vl(local_6c0,auVar119,6);
              local_3d0 = local_3d0 & (byte)uVar155;
              if (local_3d0 != 0) {
                auVar166._8_4_ = 0xbf800000;
                auVar166._0_8_ = 0xbf800000bf800000;
                auVar166._12_4_ = 0xbf800000;
                auVar166._16_4_ = 0xbf800000;
                auVar166._20_4_ = 0xbf800000;
                auVar166._24_4_ = 0xbf800000;
                auVar166._28_4_ = 0xbf800000;
                auVar43._8_4_ = 0x40000000;
                auVar43._0_8_ = 0x4000000040000000;
                auVar43._12_4_ = 0x40000000;
                auVar43._16_4_ = 0x40000000;
                auVar43._20_4_ = 0x40000000;
                auVar43._24_4_ = 0x40000000;
                auVar43._28_4_ = 0x40000000;
                local_460 = vfmadd132ps_avx512vl(local_300,auVar166,auVar43);
                local_300 = local_460;
                auVar119 = local_300;
                local_420 = (undefined4)lVar89;
                local_410 = local_760;
                uStack_408 = uStack_758;
                local_400 = local_6e0._0_8_;
                uStack_3f8 = local_6e0._8_8_;
                local_3f0 = local_6f0._0_8_;
                uStack_3e8 = local_6f0._8_8_;
                local_3e0 = local_6d0;
                uStack_3d8 = uStack_6c8;
                pGVar11 = (context->scene->geometries).items[uVar7].ptr;
                local_300 = auVar119;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar100 = vcvtsi2ss_avx512f(auVar245._0_16_,local_420);
                  fVar193 = auVar100._0_4_;
                  local_3c0[0] = (fVar193 + local_6a0._0_4_ + 0.0) * local_320;
                  local_3c0[1] = (fVar193 + local_6a0._4_4_ + 1.0) * fStack_31c;
                  local_3c0[2] = (fVar193 + local_6a0._8_4_ + 2.0) * fStack_318;
                  local_3c0[3] = (fVar193 + local_6a0._12_4_ + 3.0) * fStack_314;
                  fStack_3b0 = (fVar193 + local_6a0._16_4_ + 4.0) * fStack_310;
                  fStack_3ac = (fVar193 + local_6a0._20_4_ + 5.0) * fStack_30c;
                  fStack_3a8 = (fVar193 + local_6a0._24_4_ + 6.0) * fStack_308;
                  fStack_3a4 = fVar193 + local_6a0._28_4_ + 7.0;
                  local_300._0_8_ = local_460._0_8_;
                  local_300._8_8_ = local_460._8_8_;
                  local_300._16_8_ = local_460._16_8_;
                  local_300._24_8_ = local_460._24_8_;
                  local_3a0 = local_300._0_8_;
                  uStack_398 = local_300._8_8_;
                  uStack_390 = local_300._16_8_;
                  uStack_388 = local_300._24_8_;
                  local_380 = local_6c0;
                  auVar167._8_4_ = 0x7f800000;
                  auVar167._0_8_ = 0x7f8000007f800000;
                  auVar167._12_4_ = 0x7f800000;
                  auVar167._16_4_ = 0x7f800000;
                  auVar167._20_4_ = 0x7f800000;
                  auVar167._24_4_ = 0x7f800000;
                  auVar167._28_4_ = 0x7f800000;
                  auVar119 = vblendmps_avx512vl(auVar167,local_6c0);
                  auVar140._0_4_ =
                       (uint)(local_3d0 & 1) * auVar119._0_4_ |
                       (uint)!(bool)(local_3d0 & 1) * 0x7f800000;
                  bVar16 = (bool)(local_3d0 >> 1 & 1);
                  auVar140._4_4_ = (uint)bVar16 * auVar119._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_3d0 >> 2 & 1);
                  auVar140._8_4_ = (uint)bVar16 * auVar119._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_3d0 >> 3 & 1);
                  auVar140._12_4_ = (uint)bVar16 * auVar119._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_3d0 >> 4 & 1);
                  auVar140._16_4_ = (uint)bVar16 * auVar119._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_3d0 >> 5 & 1);
                  auVar140._20_4_ = (uint)bVar16 * auVar119._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_3d0 >> 6 & 1);
                  auVar140._24_4_ = (uint)bVar16 * auVar119._24_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar140._28_4_ =
                       (uint)(local_3d0 >> 7) * auVar119._28_4_ |
                       (uint)!(bool)(local_3d0 >> 7) * 0x7f800000;
                  auVar119 = vshufps_avx(auVar140,auVar140,0xb1);
                  auVar119 = vminps_avx(auVar140,auVar119);
                  auVar121 = vshufpd_avx(auVar119,auVar119,5);
                  auVar119 = vminps_avx(auVar119,auVar121);
                  auVar121 = vpermpd_avx2(auVar119,0x4e);
                  auVar119 = vminps_avx(auVar119,auVar121);
                  uVar155 = vcmpps_avx512vl(auVar140,auVar119,0);
                  bVar85 = (byte)uVar155 & local_3d0;
                  bVar93 = local_3d0;
                  if (bVar85 != 0) {
                    bVar93 = bVar85;
                  }
                  uVar90 = 0;
                  for (uVar88 = (uint)bVar93; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000)
                  {
                    uVar90 = uVar90 + 1;
                  }
                  uVar86 = (ulong)uVar90;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar193 = local_3c0[uVar86];
                    uVar154 = *(undefined4 *)((long)&local_3a0 + uVar86 * 4);
                    fVar203 = 1.0 - fVar193;
                    fVar202 = fVar203 * fVar203 * -3.0;
                    auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * fVar203)),
                                               ZEXT416((uint)(fVar193 * fVar203)),
                                               ZEXT416(0xc0000000));
                    auVar99 = vfmsub132ss_fma(ZEXT416((uint)(fVar193 * fVar203)),
                                              ZEXT416((uint)(fVar193 * fVar193)),ZEXT416(0x40000000)
                                             );
                    fVar203 = auVar100._0_4_ * 3.0;
                    fVar204 = auVar99._0_4_ * 3.0;
                    fVar184 = fVar193 * fVar193 * 3.0;
                    auVar209._0_4_ = fVar184 * (float)local_6d0._0_4_;
                    auVar209._4_4_ = fVar184 * (float)local_6d0._4_4_;
                    auVar209._8_4_ = fVar184 * (float)uStack_6c8;
                    auVar209._12_4_ = fVar184 * uStack_6c8._4_4_;
                    auVar182._4_4_ = fVar204;
                    auVar182._0_4_ = fVar204;
                    auVar182._8_4_ = fVar204;
                    auVar182._12_4_ = fVar204;
                    auVar100 = vfmadd132ps_fma(auVar182,auVar209,local_6f0);
                    auVar188._4_4_ = fVar203;
                    auVar188._0_4_ = fVar203;
                    auVar188._8_4_ = fVar203;
                    auVar188._12_4_ = fVar203;
                    auVar100 = vfmadd132ps_fma(auVar188,auVar100,local_6e0);
                    auVar183._4_4_ = fVar202;
                    auVar183._0_4_ = fVar202;
                    auVar183._8_4_ = fVar202;
                    auVar183._12_4_ = fVar202;
                    auVar100 = vfmadd132ps_fma(auVar183,auVar100,auVar23);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_380 + uVar86 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar100._0_4_;
                    uVar10 = vextractps_avx(auVar100,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                    uVar10 = vextractps_avx(auVar100,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar193;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar154;
                    *(uint *)(ray + k * 4 + 0x220) = uVar8;
                    *(uint *)(ray + k * 4 + 0x240) = uVar7;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_610 = local_6e0._0_4_;
                    fStack_60c = local_6e0._4_4_;
                    fStack_608 = local_6e0._8_4_;
                    fStack_604 = local_6e0._12_4_;
                    local_710 = local_6f0;
                    local_2c0 = local_6d0;
                    uStack_2b8 = uStack_6c8;
                    local_2a0 = vmovdqa64_avx512vl(auVar245._0_32_);
                    local_480 = local_6a0;
                    local_440 = local_6c0;
                    local_41c = iVar9;
                    bVar93 = local_3d0;
                    do {
                      auVar237 = auVar238._0_16_;
                      local_600 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_200 = local_3c0[uVar86];
                      local_1e0 = *(undefined4 *)((long)&local_3a0 + uVar86 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_380 + uVar86 * 4)
                      ;
                      local_748.context = context->user;
                      fVar202 = 1.0 - local_200;
                      fVar193 = fVar202 * fVar202 * -3.0;
                      auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * fVar202)),
                                                 ZEXT416((uint)(local_200 * fVar202)),
                                                 ZEXT416(0xc0000000));
                      auVar99 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar202)),
                                                ZEXT416((uint)(local_200 * local_200)),
                                                ZEXT416(0x40000000));
                      fVar202 = auVar100._0_4_ * 3.0;
                      fVar203 = auVar99._0_4_ * 3.0;
                      fVar204 = local_200 * local_200 * 3.0;
                      auVar210._0_4_ = fVar204 * (float)local_2c0;
                      auVar210._4_4_ = fVar204 * local_2c0._4_4_;
                      auVar210._8_4_ = fVar204 * (float)uStack_2b8;
                      auVar210._12_4_ = fVar204 * uStack_2b8._4_4_;
                      auVar160._4_4_ = fVar203;
                      auVar160._0_4_ = fVar203;
                      auVar160._8_4_ = fVar203;
                      auVar160._12_4_ = fVar203;
                      auVar100 = vfmadd132ps_fma(auVar160,auVar210,local_710);
                      auVar189._4_4_ = fVar202;
                      auVar189._0_4_ = fVar202;
                      auVar189._8_4_ = fVar202;
                      auVar189._12_4_ = fVar202;
                      auVar81._4_4_ = fStack_60c;
                      auVar81._0_4_ = local_610;
                      auVar81._8_4_ = fStack_608;
                      auVar81._12_4_ = fStack_604;
                      auVar100 = vfmadd132ps_fma(auVar189,auVar100,auVar81);
                      auVar161._4_4_ = fVar193;
                      auVar161._0_4_ = fVar193;
                      auVar161._8_4_ = fVar193;
                      auVar161._12_4_ = fVar193;
                      auVar100 = vfmadd132ps_fma(auVar161,auVar100,auVar23);
                      local_260 = auVar100._0_4_;
                      auVar200._8_4_ = 1;
                      auVar200._0_8_ = 0x100000001;
                      auVar200._12_4_ = 1;
                      auVar200._16_4_ = 1;
                      auVar200._20_4_ = 1;
                      auVar200._24_4_ = 1;
                      auVar200._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar200,ZEXT1632(auVar100));
                      auVar214._8_4_ = 2;
                      auVar214._0_8_ = 0x200000002;
                      auVar214._12_4_ = 2;
                      auVar214._16_4_ = 2;
                      auVar214._20_4_ = 2;
                      auVar214._24_4_ = 2;
                      auVar214._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar214,ZEXT1632(auVar100));
                      iStack_25c = local_260;
                      iStack_258 = local_260;
                      iStack_254 = local_260;
                      iStack_250 = local_260;
                      iStack_24c = local_260;
                      iStack_248 = local_260;
                      iStack_244 = local_260;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_360._0_8_;
                      uStack_1b8 = local_360._8_8_;
                      uStack_1b0 = local_360._16_8_;
                      uStack_1a8 = local_360._24_8_;
                      local_1a0 = local_340;
                      auVar119 = vpcmpeqd_avx2(local_340,local_340);
                      local_718[1] = auVar119;
                      *local_718 = auVar119;
                      local_180 = (local_748.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_748.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_640 = local_280._0_8_;
                      uStack_638 = local_280._8_8_;
                      uStack_630 = local_280._16_8_;
                      uStack_628 = local_280._24_8_;
                      local_748.valid = (int *)&local_640;
                      local_748.geometryUserPtr = pGVar11->userPtr;
                      local_748.hit = (RTCHitN *)&local_260;
                      local_748.N = 8;
                      local_700 = (uint)bVar93;
                      local_748.ray = (RTCRayN *)ray;
                      if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar11->intersectionFilterN)(&local_748);
                        auVar119 = vmovdqa64_avx512vl(local_2a0);
                        auVar245 = ZEXT3264(auVar119);
                        auVar244 = ZEXT3264(local_520);
                        auVar243 = ZEXT3264(local_500);
                        auVar242 = ZEXT3264(local_5a0);
                        auVar241 = ZEXT3264(local_580);
                        auVar240 = ZEXT3264(local_4e0);
                        auVar239 = ZEXT3264(local_560);
                        auVar235 = ZEXT3264(local_4c0);
                        auVar236 = ZEXT3264(local_540);
                        auVar100 = vxorps_avx512vl(auVar237,auVar237);
                        auVar238 = ZEXT1664(auVar100);
                      }
                      bVar85 = (byte)local_700;
                      auVar100 = auVar238._0_16_;
                      auVar77._8_8_ = uStack_638;
                      auVar77._0_8_ = local_640;
                      auVar77._16_8_ = uStack_630;
                      auVar77._24_8_ = uStack_628;
                      if (auVar77 == (undefined1  [32])0x0) {
LAB_01c871c4:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_600;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_748);
                          bVar85 = (byte)local_700;
                          auVar119 = vmovdqa64_avx512vl(local_2a0);
                          auVar245 = ZEXT3264(auVar119);
                          auVar244 = ZEXT3264(local_520);
                          auVar243 = ZEXT3264(local_500);
                          auVar242 = ZEXT3264(local_5a0);
                          auVar241 = ZEXT3264(local_580);
                          auVar240 = ZEXT3264(local_4e0);
                          auVar239 = ZEXT3264(local_560);
                          auVar235 = ZEXT3264(local_4c0);
                          auVar236 = ZEXT3264(local_540);
                          auVar100 = vxorps_avx512vl(auVar100,auVar100);
                          auVar238 = ZEXT1664(auVar100);
                        }
                        auVar78._8_8_ = uStack_638;
                        auVar78._0_8_ = local_640;
                        auVar78._16_8_ = uStack_630;
                        auVar78._24_8_ = uStack_628;
                        if (auVar78 == (undefined1  [32])0x0) goto LAB_01c871c4;
                        uVar31 = vptestmd_avx512vl(auVar78,auVar78);
                        iVar1 = *(int *)(local_748.hit + 4);
                        iVar2 = *(int *)(local_748.hit + 8);
                        iVar71 = *(int *)(local_748.hit + 0xc);
                        iVar72 = *(int *)(local_748.hit + 0x10);
                        iVar73 = *(int *)(local_748.hit + 0x14);
                        iVar74 = *(int *)(local_748.hit + 0x18);
                        iVar75 = *(int *)(local_748.hit + 0x1c);
                        bVar93 = (byte)uVar31;
                        bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar31 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar31 >> 6) & 1);
                        bVar22 = SUB81(uVar31 >> 7,0);
                        *(uint *)(local_748.ray + 0x180) =
                             (uint)(bVar93 & 1) * *(int *)local_748.hit |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_748.ray + 0x180);
                        *(uint *)(local_748.ray + 0x184) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_748.ray + 0x184);
                        *(uint *)(local_748.ray + 0x188) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_748.ray + 0x188);
                        *(uint *)(local_748.ray + 0x18c) =
                             (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_748.ray + 0x18c)
                        ;
                        *(uint *)(local_748.ray + 400) =
                             (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_748.ray + 400);
                        *(uint *)(local_748.ray + 0x194) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_748.ray + 0x194)
                        ;
                        *(uint *)(local_748.ray + 0x198) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_748.ray + 0x198)
                        ;
                        *(uint *)(local_748.ray + 0x19c) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_748.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_748.hit + 0x24);
                        iVar2 = *(int *)(local_748.hit + 0x28);
                        iVar71 = *(int *)(local_748.hit + 0x2c);
                        iVar72 = *(int *)(local_748.hit + 0x30);
                        iVar73 = *(int *)(local_748.hit + 0x34);
                        iVar74 = *(int *)(local_748.hit + 0x38);
                        iVar75 = *(int *)(local_748.hit + 0x3c);
                        bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar31 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar31 >> 6) & 1);
                        bVar22 = SUB81(uVar31 >> 7,0);
                        *(uint *)(local_748.ray + 0x1a0) =
                             (uint)(bVar93 & 1) * *(int *)(local_748.hit + 0x20) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_748.ray + 0x1a0);
                        *(uint *)(local_748.ray + 0x1a4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_748.ray + 0x1a4);
                        *(uint *)(local_748.ray + 0x1a8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_748.ray + 0x1a8);
                        *(uint *)(local_748.ray + 0x1ac) =
                             (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_748.ray + 0x1ac)
                        ;
                        *(uint *)(local_748.ray + 0x1b0) =
                             (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_748.ray + 0x1b0)
                        ;
                        *(uint *)(local_748.ray + 0x1b4) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_748.ray + 0x1b4)
                        ;
                        *(uint *)(local_748.ray + 0x1b8) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_748.ray + 0x1b8)
                        ;
                        *(uint *)(local_748.ray + 0x1bc) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_748.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_748.hit + 0x44);
                        iVar2 = *(int *)(local_748.hit + 0x48);
                        iVar71 = *(int *)(local_748.hit + 0x4c);
                        iVar72 = *(int *)(local_748.hit + 0x50);
                        iVar73 = *(int *)(local_748.hit + 0x54);
                        iVar74 = *(int *)(local_748.hit + 0x58);
                        iVar75 = *(int *)(local_748.hit + 0x5c);
                        bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar31 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar31 >> 6) & 1);
                        bVar22 = SUB81(uVar31 >> 7,0);
                        *(uint *)(local_748.ray + 0x1c0) =
                             (uint)(bVar93 & 1) * *(int *)(local_748.hit + 0x40) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_748.ray + 0x1c0);
                        *(uint *)(local_748.ray + 0x1c4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_748.ray + 0x1c4);
                        *(uint *)(local_748.ray + 0x1c8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_748.ray + 0x1c8);
                        *(uint *)(local_748.ray + 0x1cc) =
                             (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_748.ray + 0x1cc)
                        ;
                        *(uint *)(local_748.ray + 0x1d0) =
                             (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_748.ray + 0x1d0)
                        ;
                        *(uint *)(local_748.ray + 0x1d4) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_748.ray + 0x1d4)
                        ;
                        *(uint *)(local_748.ray + 0x1d8) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_748.ray + 0x1d8)
                        ;
                        *(uint *)(local_748.ray + 0x1dc) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_748.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_748.hit + 100);
                        iVar2 = *(int *)(local_748.hit + 0x68);
                        iVar71 = *(int *)(local_748.hit + 0x6c);
                        iVar72 = *(int *)(local_748.hit + 0x70);
                        iVar73 = *(int *)(local_748.hit + 0x74);
                        iVar74 = *(int *)(local_748.hit + 0x78);
                        iVar75 = *(int *)(local_748.hit + 0x7c);
                        bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar31 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar31 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar31 >> 6) & 1);
                        bVar22 = SUB81(uVar31 >> 7,0);
                        *(uint *)(local_748.ray + 0x1e0) =
                             (uint)(bVar93 & 1) * *(int *)(local_748.hit + 0x60) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_748.ray + 0x1e0);
                        *(uint *)(local_748.ray + 0x1e4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_748.ray + 0x1e4);
                        *(uint *)(local_748.ray + 0x1e8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_748.ray + 0x1e8);
                        *(uint *)(local_748.ray + 0x1ec) =
                             (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_748.ray + 0x1ec)
                        ;
                        *(uint *)(local_748.ray + 0x1f0) =
                             (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_748.ray + 0x1f0)
                        ;
                        *(uint *)(local_748.ray + 500) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_748.ray + 500);
                        *(uint *)(local_748.ray + 0x1f8) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_748.ray + 0x1f8)
                        ;
                        *(uint *)(local_748.ray + 0x1fc) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_748.ray + 0x1fc)
                        ;
                        auVar141._0_4_ =
                             (uint)(bVar93 & 1) * *(int *)(local_748.hit + 0x80) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_748.ray + 0x200);
                        bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
                        auVar141._4_4_ =
                             (uint)bVar16 * *(int *)(local_748.hit + 0x84) |
                             (uint)!bVar16 * *(int *)(local_748.ray + 0x204);
                        bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
                        auVar141._8_4_ =
                             (uint)bVar16 * *(int *)(local_748.hit + 0x88) |
                             (uint)!bVar16 * *(int *)(local_748.ray + 0x208);
                        bVar16 = (bool)((byte)(uVar31 >> 3) & 1);
                        auVar141._12_4_ =
                             (uint)bVar16 * *(int *)(local_748.hit + 0x8c) |
                             (uint)!bVar16 * *(int *)(local_748.ray + 0x20c);
                        bVar16 = (bool)((byte)(uVar31 >> 4) & 1);
                        auVar141._16_4_ =
                             (uint)bVar16 * *(int *)(local_748.hit + 0x90) |
                             (uint)!bVar16 * *(int *)(local_748.ray + 0x210);
                        bVar16 = (bool)((byte)(uVar31 >> 5) & 1);
                        auVar141._20_4_ =
                             (uint)bVar16 * *(int *)(local_748.hit + 0x94) |
                             (uint)!bVar16 * *(int *)(local_748.ray + 0x214);
                        bVar16 = (bool)((byte)(uVar31 >> 6) & 1);
                        auVar141._24_4_ =
                             (uint)bVar16 * *(int *)(local_748.hit + 0x98) |
                             (uint)!bVar16 * *(int *)(local_748.ray + 0x218);
                        bVar16 = SUB81(uVar31 >> 7,0);
                        auVar141._28_4_ =
                             (uint)bVar16 * *(int *)(local_748.hit + 0x9c) |
                             (uint)!bVar16 * *(int *)(local_748.ray + 0x21c);
                        *(undefined1 (*) [32])(local_748.ray + 0x200) = auVar141;
                        auVar119 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_748.hit + 0xa0));
                        *(undefined1 (*) [32])(local_748.ray + 0x220) = auVar119;
                        auVar119 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_748.hit + 0xc0));
                        *(undefined1 (*) [32])(local_748.ray + 0x240) = auVar119;
                        auVar119 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_748.hit + 0xe0));
                        *(undefined1 (*) [32])(local_748.ray + 0x260) = auVar119;
                        auVar119 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_748.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_748.ray + 0x280) = auVar119;
                      }
                      bVar85 = ~(byte)(1 << ((uint)uVar86 & 0x1f)) & bVar85;
                      uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar44._4_4_ = uVar154;
                      auVar44._0_4_ = uVar154;
                      auVar44._8_4_ = uVar154;
                      auVar44._12_4_ = uVar154;
                      auVar44._16_4_ = uVar154;
                      auVar44._20_4_ = uVar154;
                      auVar44._24_4_ = uVar154;
                      auVar44._28_4_ = uVar154;
                      uVar155 = vcmpps_avx512vl(local_6c0,auVar44,2);
                      bVar93 = bVar85 & (byte)uVar155;
                      if ((bVar85 & (byte)uVar155) != 0) {
                        auVar168._8_4_ = 0x7f800000;
                        auVar168._0_8_ = 0x7f8000007f800000;
                        auVar168._12_4_ = 0x7f800000;
                        auVar168._16_4_ = 0x7f800000;
                        auVar168._20_4_ = 0x7f800000;
                        auVar168._24_4_ = 0x7f800000;
                        auVar168._28_4_ = 0x7f800000;
                        auVar119 = vblendmps_avx512vl(auVar168,local_6c0);
                        auVar142._0_4_ =
                             (uint)(bVar93 & 1) * auVar119._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 1 & 1);
                        auVar142._4_4_ = (uint)bVar16 * auVar119._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 2 & 1);
                        auVar142._8_4_ = (uint)bVar16 * auVar119._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 3 & 1);
                        auVar142._12_4_ =
                             (uint)bVar16 * auVar119._12_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 4 & 1);
                        auVar142._16_4_ =
                             (uint)bVar16 * auVar119._16_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 5 & 1);
                        auVar142._20_4_ =
                             (uint)bVar16 * auVar119._20_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 6 & 1);
                        auVar142._24_4_ =
                             (uint)bVar16 * auVar119._24_4_ | (uint)!bVar16 * 0x7f800000;
                        auVar142._28_4_ =
                             (uint)(bVar93 >> 7) * auVar119._28_4_ |
                             (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                        auVar119 = vshufps_avx(auVar142,auVar142,0xb1);
                        auVar119 = vminps_avx(auVar142,auVar119);
                        auVar121 = vshufpd_avx(auVar119,auVar119,5);
                        auVar119 = vminps_avx(auVar119,auVar121);
                        auVar121 = vpermpd_avx2(auVar119,0x4e);
                        auVar119 = vminps_avx(auVar119,auVar121);
                        uVar155 = vcmpps_avx512vl(auVar142,auVar119,0);
                        bVar84 = (byte)uVar155 & bVar93;
                        bVar85 = bVar93;
                        if (bVar84 != 0) {
                          bVar85 = bVar84;
                        }
                        uVar90 = 0;
                        for (uVar88 = (uint)bVar85; (uVar88 & 1) == 0;
                            uVar88 = uVar88 >> 1 | 0x80000000) {
                          uVar90 = uVar90 + 1;
                        }
                        uVar86 = (ulong)uVar90;
                      }
                    } while (bVar93 != 0);
                  }
                }
              }
            }
          }
          lVar89 = lVar89 + 8;
        } while ((int)lVar89 < iVar9);
      }
      uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar36._4_4_ = uVar154;
      auVar36._0_4_ = uVar154;
      auVar36._8_4_ = uVar154;
      auVar36._12_4_ = uVar154;
      uVar155 = vcmpps_avx512vl(local_2b0,auVar36,2);
      uVar90 = (uint)uVar92 & (uint)uVar92 + 0xf & (uint)uVar155;
      uVar92 = (ulong)uVar90;
    } while (uVar90 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }